

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::handleMessage
          (RpcConnectionState *this,Own<capnp::IncomingRpcMessage> *message)

{
  uint *puVar1;
  PromiseNode **ppPVar2;
  ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer> *this_00;
  ErrorHandler *pEVar3;
  Exception *exception;
  byte bVar4;
  short sVar5;
  IncomingRpcMessage *pIVar6;
  undefined8 *puVar7;
  uint *puVar8;
  size_t sVar9;
  ArrayDisposer *pAVar10;
  Disposer *pDVar11;
  PipelineHook *pPVar12;
  PromiseFulfiller<kj::Own<capnp::ClientHook>_> *pPVar13;
  Embargo *pEVar14;
  PromiseFulfiller<void> *pPVar15;
  PromiseNode *pPVar16;
  Builder builder;
  Reader descriptor;
  Reader capTable;
  Reader capTable_00;
  undefined8 uVar17;
  Disposer DVar18;
  uint uVar19;
  undefined8 uVar20;
  undefined4 uVar21;
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar22;
  undefined8 uVar23;
  undefined1 uVar24;
  Maybe<capnp::_::(anonymous_namespace)::RpcConnectionState::Answer_&> MVar25;
  long *plVar26;
  RpcConnectionState *pRVar27;
  TransformPromiseNodeBase *pTVar28;
  mapped_type *pmVar29;
  PipelineHook *pPVar30;
  Maybe<capnp::_::(anonymous_namespace)::RpcConnectionState::Import_&> MVar31;
  RpcCallContext *pRVar32;
  RpcCallContext *pRVar33;
  SegmentReader *pSVar34;
  AttachmentPromiseNodeBase *pAVar35;
  int iVar36;
  Refcounted *refcounted_2;
  uint64_t methodId;
  uint refcount;
  ulong uVar37;
  CapTableReader *interfaceId;
  uint uVar38;
  Disposer *disposerCopy;
  RpcConnectionState *pRVar39;
  ExportId id;
  long lVar40;
  RpcConnectionState *pRVar41;
  _func_int *p_Var42;
  ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer> *this_01;
  long lVar43;
  undefined8 uVar44;
  uint16_t uVar45;
  Refcounted *refcounted_3;
  WirePointer *pWVar46;
  PromiseNode *pPVar47;
  RpcCallContext *ptrCopy;
  long lVar48;
  bool bVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  Own<capnp::ClientHook> OVar52;
  MessageSizeCounts MVar53;
  Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> PVar54;
  Own<capnp::ClientHook> replacement;
  Fault f_3;
  ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> forked;
  PromiseForResult<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:2346:36),_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>_>,_void>
  resultsPromise;
  Refcounted *refcounted;
  Fault f_1;
  Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> capTableArray_1;
  PromiseFulfillerPair<void> cancelPaf;
  ReaderFor<capnp::rpc::Message> reader;
  Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> capTableArray;
  Reader resolve;
  Reader cap;
  undefined1 local_4c8 [16];
  RpcConnectionState *local_4b8;
  undefined1 local_4a8 [12];
  undefined4 uStack_49c;
  RpcConnectionState *local_498;
  RpcConnectionState *local_490;
  undefined8 local_488;
  anon_union_24_1_a8c68091_for_NullableValue<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>_2
  local_480;
  Own<kj::_::PromiseNode> local_468;
  undefined1 local_458 [32];
  undefined1 local_438 [48];
  Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> local_408;
  undefined1 local_3e8 [32];
  undefined1 local_3c8 [12];
  undefined4 uStack_3bc;
  undefined8 local_3b8;
  int iStack_3b0;
  undefined4 uStack_3ac;
  undefined1 local_398 [48];
  Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> local_368;
  anon_union_16_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>_2
  local_348;
  undefined8 local_338;
  Own<kj::_::PromiseNode> local_330 [2];
  undefined8 uStack_310;
  undefined1 local_308 [12];
  undefined4 uStack_2fc;
  undefined8 local_2f8;
  int iStack_2f0;
  undefined4 uStack_2ec;
  anon_union_16_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>_2
  local_2e8 [3];
  undefined8 local_2b8;
  undefined1 local_2b0 [272];
  Maybe<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext_&> local_1a0;
  undefined1 local_198 [24];
  int iStack_180;
  undefined4 uStack_17c;
  undefined1 local_178 [24];
  anon_union_16_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>_2
  aStack_160;
  undefined8 uStack_150;
  undefined8 local_148;
  
  (**message->ptr->_vptr_IncomingRpcMessage)(local_198);
  local_2f8 = local_198._16_8_;
  _iStack_2f0 = _iStack_180;
  local_308._0_8_ = local_198._0_8_;
  stack0xfffffffffffffd00 = local_198._8_8_;
  PointerReader::getStruct((StructReader *)local_398,(PointerReader *)local_308,(word *)0x0);
  if ((uint)local_398._32_4_ < 0x10) {
switchD_003afa05_caseD_0:
    bVar49 = local_398._36_2_ == 0;
    local_2f8 = local_398._24_8_;
    if (bVar49) {
      local_2f8 = (RpcConnectionState *)0x0;
    }
    iStack_2f0 = 0x7fffffff;
    if (!bVar49) {
      iStack_2f0 = local_398._40_4_;
    }
    local_308._0_4_ = 0;
    local_308._4_4_ = 0;
    local_308._8_4_ = 0;
    uStack_2fc = 0;
    if (!bVar49) {
      local_308._0_4_ = local_398._0_4_;
      local_308._4_4_ = local_398._4_4_;
      local_308._8_4_ = local_398._8_4_;
      uStack_2fc = local_398._12_4_;
    }
    PointerReader::getStruct((StructReader *)local_438,(PointerReader *)local_308,(word *)0x0);
    if ((uint)local_438._32_4_ < 0x10) {
      uVar38 = 0;
    }
    else {
      uVar38 = (uint)*(ushort *)local_438._16_8_;
      if (*(ushort *)local_438._16_8_ == 5) {
        bVar49 = local_438._36_2_ == 0;
        local_198._16_8_ = local_438._24_8_;
        if (bVar49) {
          local_198._16_8_ = (RpcConnectionState *)0x0;
        }
        iVar36 = 0x7fffffff;
        if (!bVar49) {
          iVar36 = local_438._40_4_;
        }
        local_198[8] = false;
        local_198._9_3_ = 0;
        local_198._0_4_ = 0;
        local_198._4_4_ = 0;
        local_198._12_4_ = 0;
        if (!bVar49) {
          local_198._0_4_ = local_438._0_4_;
          local_198._4_4_ = local_438._4_4_;
          local_198._8_4_ = local_438._8_4_;
          local_198._12_4_ = local_438._12_4_;
        }
        iStack_180 = iVar36;
        PointerReader::getStruct((StructReader *)local_308,(PointerReader *)local_198,(word *)0x0);
        if ((0x2f < (uint)local_2e8[0]._0_4_) && (*(short *)(local_2f8 + 4) != 0)) {
          return;
        }
        bVar49 = local_2e8[0]._4_2_ == FAILED;
        local_498 = (RpcConnectionState *)_iStack_2f0;
        if (bVar49) {
          local_498 = (RpcConnectionState *)0x0;
        }
        uVar50 = 0x7fffffff;
        if (!bVar49) {
          uVar50 = local_2e8[0]._8_4_;
        }
        local_4a8._0_4_ = 0;
        local_4a8._4_4_ = 0;
        local_4a8._8_4_ = 0;
        uStack_49c = 0;
        if (!bVar49) {
          local_4a8._0_4_ = local_308._0_4_;
          local_4a8._4_4_ = local_308._4_4_;
          local_4a8._8_4_ = local_308._8_4_;
          uStack_49c = uStack_2fc;
        }
        local_490 = (RpcConnectionState *)CONCAT44(local_490._4_4_,uVar50);
        PointerReader::getStruct((StructReader *)local_198,(PointerReader *)local_4a8,(word *)0x0);
        if ((uint)local_178._0_4_ < 0x10) {
          return;
        }
        sVar5 = *(short *)local_198._16_8_;
        if (sVar5 == 5) {
          id = 0;
          bVar49 = local_178._4_2_ == 0;
          local_3b8 = _iStack_180;
          if (bVar49) {
            local_3b8 = (RpcConnectionState *)0x0;
          }
          iVar36 = 0x7fffffff;
          if (!bVar49) {
            iVar36 = local_178._8_4_;
          }
          uVar51._0_1_ = false;
          uVar51._1_3_ = 0;
          local_3c8._0_4_ = 0;
          local_3c8._4_4_ = 0;
          uStack_3bc = 0;
          if (!bVar49) {
            local_3c8._0_4_ = local_198._0_4_;
            local_3c8._4_4_ = local_198._4_4_;
            uVar51 = local_198._8_4_;
            uStack_3bc = local_198._12_4_;
          }
          local_3c8[8] = SUB41(uVar51,0);
          local_3c8._9_3_ = SUB43(uVar51,1);
          iStack_3b0 = iVar36;
          PointerReader::getStruct((StructReader *)local_4a8,(PointerReader *)local_3c8,(word *)0x0)
          ;
          if (0x1f < (uint)local_488) {
            id = *(ExportId *)&(local_498->super_ErrorHandler)._vptr_ErrorHandler;
          }
        }
        else {
          if ((sVar5 != 2) && (sVar5 != 1)) {
            return;
          }
          id = 0;
          if (0x3f < (uint)local_178._0_4_) {
            id = *(ExportId *)(local_198._16_8_ + 4);
          }
        }
        refcount = 1;
LAB_003b0774:
        releaseExport(this,id,refcount);
        return;
      }
    }
    local_198._0_4_ = uVar38;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50],unsigned_int>
              ((Fault *)local_308,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
               ,0x88f,FAILED,(char *)0x0,
               "\"Peer did not implement required RPC message type.\", (uint)message.which()",
               (char (*) [50])"Peer did not implement required RPC message type.",(uint *)local_198)
    ;
    kj::_::Debug::Fault::fatal((Fault *)local_308);
  }
  switch(*(undefined2 *)local_398._16_8_) {
  case 0:
    goto switchD_003afa05_caseD_0;
  case 1:
    bVar49 = local_398._36_2_ == 0;
    local_2f8 = local_398._24_8_;
    if (bVar49) {
      local_2f8 = (RpcConnectionState *)0x0;
    }
    iStack_2f0 = 0x7fffffff;
    if (!bVar49) {
      iStack_2f0 = local_398._40_4_;
    }
    local_308._0_4_ = 0;
    local_308._4_4_ = 0;
    local_308._8_4_ = 0;
    uStack_2fc = 0;
    if (!bVar49) {
      local_308._0_4_ = local_398._0_4_;
      local_308._4_4_ = local_398._4_4_;
      local_308._8_4_ = local_398._8_4_;
      uStack_2fc = local_398._12_4_;
    }
    PointerReader::getStruct((StructReader *)local_198,(PointerReader *)local_308,(word *)0x0);
    toException((Exception *)local_308,(Reader *)local_198);
    kj::throwRecoverableException((Exception *)local_308,0);
    kj::Exception::~Exception((Exception *)local_308);
    return;
  case 2:
    bVar49 = local_398._36_2_ == 0;
    local_2f8 = local_398._24_8_;
    if (bVar49) {
      local_2f8 = (RpcConnectionState *)0x0;
    }
    uVar37 = 0x7fffffff;
    if (bVar49) {
      local_398._40_4_ = 0x7fffffff;
    }
    local_308._0_4_ = 0;
    local_308._4_4_ = 0;
    local_308._8_4_ = 0;
    uStack_2fc = 0;
    if (!bVar49) {
      local_308._0_4_ = local_398._0_4_;
      local_308._4_4_ = local_398._4_4_;
      local_308._8_4_ = local_398._8_4_;
      uStack_2fc = local_398._12_4_;
    }
    iStack_2f0 = local_398._40_4_;
    PointerReader::getStruct((StructReader *)local_4a8,(PointerReader *)local_308,(word *)0x0);
    local_198._16_8_ = (RpcConnectionState *)0x0;
    if (local_488._4_2_ != 0) {
      uVar37 = (ulong)local_480.value._vptr_Client & 0xffffffff;
      local_198._16_8_ = local_490;
    }
    local_198._0_4_ = 0;
    local_198._4_4_ = 0;
    local_198._8_4_ = 0;
    local_198._12_4_ = 0;
    if (local_488._4_2_ != 0) {
      local_198._0_4_ = local_4a8._0_4_;
      local_198._4_4_ = local_4a8._4_4_;
      local_198._8_4_ = local_4a8._8_4_;
      local_198._12_4_ = uStack_49c;
    }
    iStack_180 = (int)uVar37;
    PointerReader::getStruct((StructReader *)local_308,(PointerReader *)local_198,(word *)0x0);
    getMessageTarget((RpcConnectionState *)local_198,(Reader *)this);
    pRVar27 = (RpcConnectionState *)local_198._8_8_;
    pRVar39 = (RpcConnectionState *)local_198._0_8_;
    if ((RpcConnectionState *)local_198._8_8_ == (RpcConnectionState *)0x0) {
      return;
    }
    local_408.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)local_198._0_8_;
    local_408.size_ = local_198._8_8_;
    if (((uint)local_488 < 0x40) ||
       (sVar5 = *(short *)((long)&(local_498->super_ErrorHandler)._vptr_ErrorHandler + 6),
       sVar5 == 0)) {
      uVar50 = 0;
LAB_003b0780:
      local_198._16_8_ = &local_490->super_Refcounted;
      if (local_488._4_2_ < 2) {
        local_198._16_8_ = (RpcConnectionState *)0x0;
      }
      if (local_488._4_2_ < 2) {
        local_198._0_4_ = 0;
        local_198._4_4_ = 0;
        local_198._8_4_ = 0;
        local_198._12_4_ = 0;
        uVar51 = 0x7fffffff;
      }
      else {
        local_198._0_4_ = local_4a8._0_4_;
        local_198._4_4_ = local_4a8._4_4_;
        local_198._8_4_ = local_4a8._8_4_;
        local_198._12_4_ = uStack_49c;
        uVar51 = local_480._0_4_;
      }
      iStack_180 = uVar51;
      PointerReader::getStruct((StructReader *)local_308,(PointerReader *)local_198,(word *)0x0);
      local_438._16_8_ = (Refcounted *)(_iStack_2f0 + 8);
      if ((ushort)local_2e8[0]._4_2_ < DISCONNECTED) {
        local_438._16_8_ = (Refcounted *)0x0;
      }
      if ((ushort)local_2e8[0]._4_2_ < DISCONNECTED) {
        local_438._0_4_ = 0;
        local_438._4_4_ = 0;
        local_438._8_4_ = 0;
        local_438._12_4_ = 0;
        uVar51 = 0x7fffffff;
      }
      else {
        local_438._0_4_ = local_308._0_4_;
        local_438._4_4_ = local_308._4_4_;
        local_438._8_4_ = local_308._8_4_;
        local_438._12_4_ = uStack_2fc;
        uVar51 = local_2e8[0]._8_4_;
      }
      local_438._24_4_ = uVar51;
      PointerReader::getList
                ((ListReader *)local_198,(PointerReader *)local_438,INLINE_COMPOSITE,(word *)0x0);
      capTable.reader.capTable = (CapTableReader *)local_198._8_8_;
      capTable.reader.segment = (SegmentReader *)local_198._0_8_;
      capTable.reader.ptr = (byte *)local_198._16_8_;
      capTable.reader._24_8_ = _iStack_180;
      capTable.reader.structDataSize = local_178._0_4_;
      capTable.reader.structPointerCount = local_178._4_2_;
      capTable.reader.elementSize = local_178[6];
      capTable.reader._39_1_ = local_178[7];
      capTable.reader._40_8_ = local_178._8_8_;
      receiveCaps(&local_368,this,capTable);
      kj::newPromiseAndFulfiller<void>();
      local_348._0_4_ = 0;
      if (0x1f < (uint)local_488) {
        local_348._0_4_ = *(undefined4 *)&(local_498->super_ErrorHandler)._vptr_ErrorHandler;
      }
      bVar49 = local_2e8[0]._4_2_ != FAILED;
      local_1a0.ptr = (RpcCallContext *)(RpcConnectionState *)0x0;
      if (bVar49) {
        local_1a0.ptr = (RpcCallContext *)_iStack_2f0;
      }
      local_330[1].disposer._0_4_ = 0x7fffffff;
      if (bVar49) {
        local_330[1].disposer._0_4_ = local_2e8[0]._8_4_;
      }
      local_330[1].ptr = (PromiseNode *)0x0;
      uStack_310 = (RpcConnectionState *)0x0;
      if (bVar49) {
        local_330[1].ptr = (PromiseNode *)local_308._0_8_;
        uStack_310 = stack0xfffffffffffffd00;
      }
      if ((uint)local_488 < 0x80) {
        if (0x2f < (uint)local_488) {
          local_338 = (CapTableReader *)0x0;
          goto LAB_003b10fc;
        }
        local_338 = (CapTableReader *)0x0;
        uVar45 = 0;
      }
      else {
        local_338 = (local_498->super_Refcounted).super_Disposer._vptr_Disposer;
LAB_003b10fc:
        uVar45 = *(uint16_t *)((long)&(local_498->super_ErrorHandler)._vptr_ErrorHandler + 4);
      }
      local_330[1].disposer._4_4_ = uVar50;
      pRVar32 = (RpcCallContext *)operator_new(0x108);
      sVar9 = local_368.size_;
      pMVar22 = local_368.ptr;
      local_458._0_8_ = local_368.ptr;
      local_458._8_8_ = local_368.size_;
      local_368.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
      local_368.size_ = 0;
      local_458._24_8_ = &pRVar32->super_Refcounted;
      (pRVar32->super_Refcounted).refcount = 0;
      (pRVar32->super_CallContextHook)._vptr_CallContextHook = (_func_int **)&PTR_getParams_006210d8
      ;
      (pRVar32->super_Refcounted).super_Disposer._vptr_Disposer =
           (_func_int **)&PTR_disposeImpl_00621138;
      puVar1 = &(this->super_Refcounted).refcount;
      *puVar1 = *puVar1 + 1;
      (pRVar32->connectionState).disposer = &(this->super_Refcounted).super_Disposer;
      (pRVar32->connectionState).ptr = this;
      pRVar32->answerId = local_348._0_4_;
      pRVar32->interfaceId = local_338;
      pRVar32->methodId = uVar45;
      local_458._16_8_ =
           (RpcConnectionState *)CONCAT71(local_368.disposer._1_7_,local_368.disposer._0_1_);
      (**message->ptr->_vptr_IncomingRpcMessage)(local_438);
      MVar53 = PointerReader::targetSize((PointerReader *)local_438);
      pRVar32->requestSize = MVar53.wordCount;
      pIVar6 = message->ptr;
      (pRVar32->request).ptr.disposer = message->disposer;
      (pRVar32->request).ptr.ptr = pIVar6;
      message->ptr = (IncomingRpcMessage *)0x0;
      local_4c8._0_8_ = pMVar22;
      local_4c8._8_8_ = sVar9;
      local_458._0_8_ = (RpcConnectionState *)0x0;
      local_458._8_8_ = (RpcCallContext *)0x0;
      local_4b8 = (RpcConnectionState *)CONCAT71(local_368.disposer._1_7_,local_368.disposer._0_1_);
      ReaderCapabilityTable::ReaderCapabilityTable
                (&pRVar32->paramsCapTable,
                 (Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)local_4c8);
      uVar50 = local_330[1].disposer._4_4_;
      uVar20 = local_458._24_8_;
      uVar17 = local_4c8._8_8_;
      uVar44 = local_4c8._0_8_;
      if ((RpcConnectionState *)local_4c8._0_8_ != (RpcConnectionState *)0x0) {
        local_4c8._0_8_ = (RpcConnectionState *)0x0;
        local_4c8._8_8_ = (TransformPromiseNodeBase *)0x0;
        (*(code *)((SegmentReader *)(local_4b8->super_ErrorHandler)._vptr_ErrorHandler)->arena)
                  (local_4b8,uVar44,0x10,uVar17,uVar17,
                   kj::ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>::
                   destruct);
      }
      local_438._0_8_ = local_330[1].ptr;
      local_438._8_8_ = uStack_310;
      local_438._16_8_ = local_1a0.ptr;
      local_438._24_4_ = local_330[1].disposer._0_4_;
      PointerReader::imbue
                (&(pRVar32->params).reader,(PointerReader *)local_438,
                 &(pRVar32->paramsCapTable).super_CapTableReader);
      (pRVar32->returnMessage)._builder.data = (void *)0x0;
      (pRVar32->returnMessage)._builder.pointers = (WirePointer *)0x0;
      (pRVar32->returnMessage)._builder.segment = (SegmentBuilder *)0x0;
      (pRVar32->returnMessage)._builder.capTable = (CapTableBuilder *)0x0;
      (pRVar32->response).ptr.disposer = (Disposer *)0x0;
      (pRVar32->response).ptr.ptr = (RpcServerResponse *)0x0;
      pRVar32->redirectResults = SUB41(uVar50,0);
      pRVar32->responseSent = false;
      (pRVar32->tailCallPipelineFulfiller).ptr.disposer = (Disposer *)0x0;
      (pRVar32->tailCallPipelineFulfiller).ptr.ptr =
           (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)0x0;
      pRVar32->cancellationFlags = '\0';
      (pRVar32->cancelFulfiller).disposer = (Disposer *)local_3b8;
      (pRVar32->cancelFulfiller).ptr = (PromiseFulfiller<void> *)_iStack_3b0;
      _iStack_3b0 = (RpcConnectionState *)0x0;
      kj::UnwindDetector::UnwindDetector(&pRVar32->unwindDetector);
      uVar44 = local_348._0_8_;
      this->callWordsInFlight = this->callWordsInFlight + pRVar32->requestSize;
      puVar1 = &(pRVar32->super_Refcounted).refcount;
      *puVar1 = *puVar1 + 1;
      uVar51 = local_348._0_4_;
      local_438._0_4_ = local_348._0_4_;
      if ((uint)local_348._0_4_ < 0x10) {
        pmVar29 = (mapped_type *)&(this->answers).low[local_348._0_8_ & 0xffffffff].active;
      }
      else {
        pmVar29 = std::
                  unordered_map<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>_>_>
                  ::operator[](&(this->answers).high,(key_type *)local_438);
      }
      if (pmVar29->active == false) {
        pmVar29->active = true;
        (pmVar29->callContext).ptr = pRVar32;
        if ((uint)local_488 < 0x80) {
          if (0x2f < (uint)local_488) {
            interfaceId = (CapTableReader *)0x0;
            goto LAB_003b1360;
          }
          interfaceId = (CapTableReader *)0x0;
          methodId = 0;
        }
        else {
          interfaceId = (CapTableReader *)
                        (local_498->super_Refcounted).super_Disposer._vptr_Disposer;
LAB_003b1360:
          methodId = (uint64_t)
                     *(ushort *)((long)&(local_498->super_ErrorHandler)._vptr_ErrorHandler + 4);
        }
        puVar1 = &(pRVar32->super_Refcounted).refcount;
        *puVar1 = *puVar1 + 1;
        local_4c8._0_8_ = uVar20;
        local_4c8._8_8_ = pRVar32;
        startCall((VoidPromiseAndPipeline *)local_438,this,(uint64_t)interfaceId,methodId,
                  (Own<capnp::ClientHook> *)(local_438 + 0x30),
                  (Own<capnp::CallContextHook> *)local_4c8);
        uVar17 = local_4c8._8_8_;
        if ((RpcCallContext *)local_4c8._8_8_ != (RpcCallContext *)0x0) {
          local_4c8._8_8_ = (RpcCallContext *)0x0;
          (**(code **)*(_func_int **)local_4c8._0_8_)
                    (local_4c8._0_8_,uVar17 + *(long *)(*(_func_int **)uVar17 + -0x10));
        }
        local_4c8._0_4_ = uVar51;
        if ((uint)uVar51 < 0x10) {
          pmVar29 = (mapped_type *)&(this->answers).low[uVar44 & 0xffffffff].active;
        }
        else {
          pmVar29 = std::
                    unordered_map<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>_>_>
                    ::operator[](&(this->answers).high,(key_type *)local_4c8);
        }
        pDVar11 = (pmVar29->pipeline).ptr.disposer;
        pPVar12 = (pmVar29->pipeline).ptr.ptr;
        uVar51 = local_438._24_4_;
        uVar21 = local_438._28_4_;
        local_438._24_8_ = (RpcConnectionState *)0x0;
        *(undefined4 *)&(pmVar29->pipeline).ptr.disposer = local_438._16_4_;
        *(undefined4 *)((long)&(pmVar29->pipeline).ptr.disposer + 4) = local_438._20_4_;
        *(undefined4 *)&(pmVar29->pipeline).ptr.ptr = uVar51;
        *(undefined4 *)((long)&(pmVar29->pipeline).ptr.ptr + 4) = uVar21;
        if (pPVar12 != (PipelineHook *)0x0) {
          (**pDVar11->_vptr_Disposer)
                    (pDVar11,(_func_int *)
                             ((long)&pPVar12->_vptr_PipelineHook +
                             (long)pPVar12->_vptr_PipelineHook[-2]));
        }
        if (SUB41(uVar50,0) == false) {
          pTVar28 = (TransformPromiseNodeBase *)operator_new(0x30);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar28,(Own<kj::_::PromiseNode> *)local_438,
                     kj::_::
                     TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2366:13),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2368:16)>
                     ::anon_class_8_1_adc9bc7d_for_func::operator());
          (pTVar28->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006217b8;
          pTVar28[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)pRVar32;
          pTVar28[1].dependency.disposer = (Disposer *)pRVar32;
          local_3e8._16_8_ =
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda()#1},capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#2}>>
                ::instance;
          local_3e8._24_8_ = pTVar28;
          pRVar33 = (RpcCallContext *)operator_new(0x30);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    ((TransformPromiseNodeBase *)pRVar33,
                     (Own<kj::_::PromiseNode> *)(local_3e8 + 0x10),
                     kj::_::IdentityFunc<void>::operator());
          (pRVar33->super_CallContextHook)._vptr_CallContextHook =
               (_func_int **)&PTR_onReady_006218d8;
          *(RpcConnectionState **)&pRVar33->answerId = this;
          local_3e8._0_8_ =
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#3}>>
                ::instance;
          local_3e8._8_8_ = pRVar33;
          pAVar35 = (AttachmentPromiseNodeBase *)operator_new(0x28);
          kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
                    (pAVar35,(Own<kj::_::PromiseNode> *)local_3e8);
          (pAVar35->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00621960;
          pAVar35[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)uVar20;
          pAVar35[1].dependency.disposer = (Disposer *)pRVar32;
          local_468.disposer =
               (Disposer *)
               &kj::_::
                HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>>>
                ::instance;
          local_468.ptr = (PromiseNode *)pAVar35;
          kj::
          heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
                    ((kj *)local_4c8,&local_468,(Own<kj::_::PromiseNode> *)local_3c8);
          local_458._0_8_ = local_4c8._0_8_;
          local_458._8_8_ = local_4c8._8_8_;
          pTVar28 = (TransformPromiseNodeBase *)operator_new(0x28);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar28,(Own<kj::_::PromiseNode> *)local_458,
                     kj::_::
                     TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/../kj/async-inl.h:992:25),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2375:21)>
                     ::anon_class_1_0_00000001_for_func::operator());
          (pTVar28->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006219e0;
          local_4c8._0_8_ =
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::Promise<void>::detach<capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#4}>(capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#4}&&)::{lambda()#1},capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#4}>>
                ::instance;
          local_4c8._8_8_ = pTVar28;
          kj::_::detach((Promise<void> *)local_4c8);
          uVar44 = local_4c8._8_8_;
          if ((TransformPromiseNodeBase *)local_4c8._8_8_ != (TransformPromiseNodeBase *)0x0) {
            local_4c8._8_8_ = (TransformPromiseNodeBase *)0x0;
            (**(code **)*(_func_int **)local_4c8._0_8_)
                      (local_4c8._0_8_,uVar44 + *(long *)(*(_func_int **)uVar44 + -0x10));
          }
          uVar44 = local_458._8_8_;
          if ((RpcCallContext *)local_458._8_8_ != (RpcCallContext *)0x0) {
            local_458._8_8_ = (RpcCallContext *)0x0;
            (***(_func_int ***)local_458._0_8_)
                      (local_458._0_8_,uVar44 + *(long *)(*(long *)uVar44 + -0x10));
          }
          pPVar47 = local_468.ptr;
          if ((AttachmentPromiseNodeBase *)local_468.ptr != (AttachmentPromiseNodeBase *)0x0) {
            local_468.ptr = (PromiseNode *)0x0;
            (**((Disposer *)&(local_468.disposer)->_vptr_Disposer)->_vptr_Disposer)
                      (local_468.disposer,
                       (_func_int *)
                       ((long)&((PromiseNode *)&pPVar47->_vptr_PromiseNode)->_vptr_PromiseNode +
                       (long)((PromiseNode *)&pPVar47->_vptr_PromiseNode)->_vptr_PromiseNode[-2]));
          }
          uVar44 = local_3e8._8_8_;
          if ((RpcCallContext *)local_3e8._8_8_ != (RpcCallContext *)0x0) {
            local_3e8._8_8_ = (RpcCallContext *)0x0;
            (***(_func_int ***)local_3e8._0_8_)
                      (local_3e8._0_8_,uVar44 + *(long *)(*(long *)uVar44 + -0x10));
          }
          uVar44 = local_3e8._24_8_;
          if ((TransformPromiseNodeBase *)local_3e8._24_8_ != (TransformPromiseNodeBase *)0x0) {
            local_3e8._24_8_ = (TransformPromiseNodeBase *)0x0;
            (*(code *)**(undefined8 **)local_3e8._16_8_)
                      (local_3e8._16_8_,uVar44 + *(long *)(*(long *)uVar44 + -0x10));
          }
        }
        else {
          pRVar33 = (RpcCallContext *)operator_new(0x40);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    ((TransformPromiseNodeBase *)pRVar33,(Own<kj::_::PromiseNode> *)local_438,
                     kj::
                     CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2346:36),_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>_>
                     ::operator()<>);
          (pRVar33->super_CallContextHook)._vptr_CallContextHook =
               (_func_int **)&PTR_onReady_00621530;
          *(undefined8 *)&pRVar33->answerId = uVar20;
          pRVar33->interfaceId = (uint64_t)pRVar32;
          local_458._0_8_ =
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>&&)#1},kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>>,kj::_::PropagateException>>
                ::instance;
          local_458._8_8_ = pRVar33;
          kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>::
          fork((Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                *)&local_468);
          pPVar47 = local_468.ptr;
          PVar54 = kj::
                   ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                   ::addBranch((ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                                *)local_4c8);
          if ((pmVar29->redirectedResults).ptr.isSet == true) {
            (pmVar29->redirectedResults).ptr.isSet = false;
            pPVar16 = (pmVar29->redirectedResults).ptr.field_1.value.super_PromiseBase.node.ptr;
            if (pPVar16 != (PromiseNode *)0x0) {
              (pmVar29->redirectedResults).ptr.field_1.value.super_PromiseBase.node.ptr =
                   (PromiseNode *)0x0;
              pDVar11 = (pmVar29->redirectedResults).ptr.field_1.value.super_PromiseBase.node.
                        disposer;
              (**pDVar11->_vptr_Disposer)
                        (pDVar11,(_func_int *)
                                 ((long)&pPVar16->_vptr_PromiseNode +
                                 (long)pPVar16->_vptr_PromiseNode[-2]),
                         PVar54.super_PromiseBase.node.ptr);
            }
          }
          (pmVar29->redirectedResults).ptr.field_1.value.super_PromiseBase.node.disposer =
               (Disposer *)local_4c8._0_8_;
          (pmVar29->redirectedResults).ptr.field_1.value.super_PromiseBase.node.ptr =
               (PromiseNode *)local_4c8._8_8_;
          (pmVar29->redirectedResults).ptr.isSet = true;
          kj::
          ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
          ::addBranch((ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                       *)local_330);
          pTVar28 = (TransformPromiseNodeBase *)operator_new(0x28);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar28,local_330,
                     kj::_::
                     TransformPromiseNode<kj::_::Void,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2358:52),_kj::_::PropagateException>
                     ::anon_class_1_0_00000001_for_func::operator());
          (pTVar28->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006216a8;
          local_3e8._16_8_ =
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>&&)#1},kj::_::PropagateException>>
                ::instance;
          local_3e8._24_8_ = pTVar28;
          kj::
          heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
                    ((kj *)local_4c8,(Own<kj::_::PromiseNode> *)local_3c8,
                     (Own<kj::_::PromiseNode> *)(local_3e8 + 0x10));
          local_3e8._0_8_ = local_4c8._0_8_;
          local_3e8._8_8_ = local_4c8._8_8_;
          pTVar28 = (TransformPromiseNodeBase *)operator_new(0x28);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar28,(Own<kj::_::PromiseNode> *)local_3e8,
                     kj::_::
                     TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/../kj/async-inl.h:992:25),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2359:21)>
                     ::anon_class_1_0_00000001_for_func::operator());
          (pTVar28->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00621730;
          local_4c8._0_8_ =
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::Promise<void>::detach<capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#1}>(capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#1}&&)::{lambda()#1},capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#1}>>
                ::instance;
          local_4c8._8_8_ = pTVar28;
          kj::_::detach((Promise<void> *)local_4c8);
          uVar44 = local_4c8._8_8_;
          if ((TransformPromiseNodeBase *)local_4c8._8_8_ != (TransformPromiseNodeBase *)0x0) {
            local_4c8._8_8_ = (TransformPromiseNodeBase *)0x0;
            (**(code **)*(_func_int **)local_4c8._0_8_)
                      (local_4c8._0_8_,uVar44 + *(long *)(*(_func_int **)uVar44 + -0x10));
          }
          uVar44 = local_3e8._8_8_;
          if ((RpcCallContext *)local_3e8._8_8_ != (RpcCallContext *)0x0) {
            local_3e8._8_8_ = (RpcCallContext *)0x0;
            (***(_func_int ***)local_3e8._0_8_)
                      (local_3e8._0_8_,uVar44 + *(long *)(*(long *)uVar44 + -0x10));
          }
          uVar44 = local_3e8._24_8_;
          if ((TransformPromiseNodeBase *)local_3e8._24_8_ != (TransformPromiseNodeBase *)0x0) {
            local_3e8._24_8_ = (TransformPromiseNodeBase *)0x0;
            (*(code *)**(undefined8 **)local_3e8._16_8_)
                      (local_3e8._16_8_,uVar44 + *(long *)(*(long *)uVar44 + -0x10));
          }
          pPVar16 = local_330[0].ptr;
          if (local_330[0].ptr != (PromiseNode *)0x0) {
            local_330[0].ptr = (PromiseNode *)0x0;
            (*(code *)*(local_330[0].disposer)->_vptr_Disposer)
                      (local_330[0].disposer,(long)pPVar16 + *(long *)(*(long *)pPVar16 + -0x10));
          }
          if ((AttachmentPromiseNodeBase *)pPVar47 != (AttachmentPromiseNodeBase *)0x0) {
            local_468.ptr = (PromiseNode *)0x0;
            (**((Disposer *)&(local_468.disposer)->_vptr_Disposer)->_vptr_Disposer)
                      (local_468.disposer,
                       (_func_int *)
                       ((long)&((PromiseNode *)&pPVar47->_vptr_PromiseNode)->_vptr_PromiseNode +
                       (long)((PromiseNode *)&pPVar47->_vptr_PromiseNode)->_vptr_PromiseNode[-2]));
          }
          uVar44 = local_458._8_8_;
          if ((RpcCallContext *)local_458._8_8_ != (RpcCallContext *)0x0) {
            local_458._8_8_ = (RpcCallContext *)0x0;
            (***(_func_int ***)local_458._0_8_)
                      (local_458._0_8_,uVar44 + *(long *)(*(long *)uVar44 + -0x10));
          }
        }
        uVar44 = local_438._24_8_;
        if ((RpcConnectionState *)local_438._24_8_ != (RpcConnectionState *)0x0) {
          local_438._24_8_ = (RpcConnectionState *)0x0;
          (*(code *)**(undefined8 **)local_438._16_8_)
                    (local_438._16_8_,uVar44 + *(long *)(*(long *)uVar44 + -0x10));
        }
        uVar44 = local_438._8_8_;
        if ((RpcConnectionState *)local_438._8_8_ != (RpcConnectionState *)0x0) {
          local_438._8_8_ = (RpcConnectionState *)0x0;
          (**(code **)*(_func_int **)local_438._0_8_)
                    (local_438._0_8_,uVar44 + *(long *)(*(_func_int **)uVar44 + -0x10));
        }
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29]>
                  ((Fault *)local_438,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x915,FAILED,"!answer.active","\"questionId is already in use\"",
                   (char (*) [29])"questionId is already in use");
        kj::_::Debug::Fault::~Fault((Fault *)local_438);
        (**(pRVar32->super_Refcounted).super_Disposer._vptr_Disposer)
                  (local_458._24_8_,
                   (_func_int *)
                   ((long)&(pRVar32->super_CallContextHook)._vptr_CallContextHook +
                   (long)(pRVar32->super_CallContextHook)._vptr_CallContextHook[-2]));
      }
      uVar44 = _iStack_3b0;
      if ((RpcConnectionState *)_iStack_3b0 != (RpcConnectionState *)0x0) {
        _iStack_3b0 = (RpcConnectionState *)0x0;
        (*(code *)**(undefined8 **)local_3b8)(local_3b8,uVar44 + *(long *)(*(long *)uVar44 + -0x10))
        ;
      }
      uVar44 = stack0xfffffffffffffc40;
      if ((TransformPromiseNodeBase *)stack0xfffffffffffffc40 != (TransformPromiseNodeBase *)0x0) {
        stack0xfffffffffffffc40 = (TransformPromiseNodeBase *)0x0;
        (**(code **)*(_func_int **)local_3c8._0_8_)
                  (local_3c8._0_8_,uVar44 + *(long *)(*(_func_int **)uVar44 + -0x10));
      }
      pRVar27 = (RpcConnectionState *)local_408.size_;
      pRVar39 = (RpcConnectionState *)local_408.ptr;
      if ((RpcConnectionState *)local_408.size_ == (RpcConnectionState *)0x0) {
        return;
      }
    }
    else {
      if (sVar5 == 1) {
        uVar50 = (undefined4)CONCAT71((int7)(uVar37 >> 8),1);
        goto LAB_003b0780;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                ((Fault *)local_308,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x902,FAILED,(char *)0x0,"\"Unsupported `Call.sendResultsTo`.\"",
                 (char (*) [34])"Unsupported `Call.sendResultsTo`.");
      kj::_::Debug::Fault::~Fault((Fault *)local_308);
    }
    local_408.size_ = 0;
    break;
  case 3:
    pRVar39 = (RpcConnectionState *)0x0;
    if (local_398._36_2_ == 0) {
      local_398._24_8_ = pRVar39;
      local_398._40_4_ = 0x7fffffff;
    }
    local_308._0_4_ = 0;
    local_308._4_4_ = 0;
    local_308._8_4_ = 0;
    uStack_2fc = 0;
    if (local_398._36_2_ != 0) {
      local_308._0_4_ = local_398._0_4_;
      local_308._4_4_ = local_398._4_4_;
      local_308._8_4_ = local_398._8_4_;
      uStack_2fc = local_398._12_4_;
    }
    iStack_2f0 = local_398._40_4_;
    local_2f8 = local_398._24_8_;
    PointerReader::getStruct((StructReader *)local_4a8,(PointerReader *)local_308,(word *)0x0);
    local_458._0_8_ = (SegmentReader *)0x0;
    local_458._8_8_ = (SegmentReader *)0x0;
    local_458._16_8_ = (CapTableReader *)0x0;
    local_368.disposer._0_1_ = 0;
    if (0x1f < (uint)local_488) {
      pRVar39 = (RpcConnectionState *)
                (ulong)*(uint *)&(local_498->super_ErrorHandler)._vptr_ErrorHandler;
    }
    pRVar27 = (RpcConnectionState *)(this->questions).slots.builder.ptr;
    pRVar41 = (RpcConnectionState *)
              (((long)(this->questions).slots.builder.pos - (long)pRVar27 >> 3) *
              -0x3333333333333333);
    plVar26 = (long *)local_458;
    local_368.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)this;
    local_368.size_ = (size_t)local_458;
    if (pRVar41 < pRVar39 || (long)pRVar41 - (long)pRVar39 == 0) {
LAB_003b06af:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
                ((Fault *)local_308,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xa05,FAILED,(char *)0x0,"\"Invalid question ID in Return message.\"",
                 (char (*) [39])"Invalid question ID in Return message.");
      kj::_::Debug::Fault::~Fault((Fault *)local_308);
    }
    else {
      pWVar46 = (WirePointer *)(&pRVar27->bootstrapFactory)[(long)pRVar39 * 5];
      bVar4 = (byte)*(StructDataBitCount *)((long)&pRVar27->gateway + (long)pRVar39 * 0x28);
      if ((pWVar46 != (WirePointer *)0x0 | bVar4) != 1) goto LAB_003b06af;
      if (bVar4 == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18]>
                  ((Fault *)local_308,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x9b5,FAILED,"question->isAwaitingReturn","\"Duplicate Return.\"",
                   (char (*) [18])"Duplicate Return.");
        kj::_::Debug::Fault::~Fault((Fault *)local_308);
        goto LAB_003b06ec;
      }
      pEVar3 = &pRVar27->super_ErrorHandler + (long)pRVar39 * 5;
      (((Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
         *)(pEVar3 + 4))->ptr).isSet = false;
      if (((uint)local_488 < 0x21) ||
         (((ulong)(local_498->super_ErrorHandler)._vptr_ErrorHandler & 0x100000000) == 0)) {
        local_458._16_8_ = pEVar3[2];
        local_458._0_8_ = pEVar3->_vptr_ErrorHandler;
        local_458._8_8_ = (((Refcounted *)(pEVar3 + 1))->super_Disposer)._vptr_Disposer;
        pEVar3->_vptr_ErrorHandler = (_func_int **)0x0;
        (((Refcounted *)(pEVar3 + 1))->super_Disposer)._vptr_Disposer = (_func_int **)0x0;
      }
      else {
        pSVar34 = (SegmentReader *)pEVar3->_vptr_ErrorHandler;
        if (pSVar34 != (SegmentReader *)0x0) {
          pRVar27 = (RpcConnectionState *)
                    (((Refcounted *)(pEVar3 + 1))->super_Disposer)._vptr_Disposer;
          puVar7 = pEVar3[2]._vptr_ErrorHandler;
          pEVar3->_vptr_ErrorHandler = (_func_int **)0x0;
          (((Refcounted *)(pEVar3 + 1))->super_Disposer)._vptr_Disposer = (_func_int **)0x0;
          (**(code **)*puVar7)(puVar7,pSVar34,4,pRVar27,pRVar27,0);
          pWVar46 = *(WirePointer **)(pEVar3 + 3);
        }
      }
      if (pWVar46 == (WirePointer *)0x0) {
        pPVar47 = (PromiseNode *)0x0;
        if ((uint)local_488 < 0x40) {
          if (0x1f < (uint)local_488) {
            bVar4 = 1;
            goto LAB_003b1dfc;
          }
          uVar38 = 0;
          bVar4 = 1;
        }
        else {
          bVar4 = 1;
          if (*(short *)((long)&(local_498->super_ErrorHandler)._vptr_ErrorHandler + 6) == 4) {
            uVar38 = 0;
            if (0x5f < (uint)local_488) {
              uVar38 = *(uint *)&(local_498->super_Refcounted).super_Disposer._vptr_Disposer;
            }
            MVar25 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>
                     ::find(&this->answers,uVar38);
            if (MVar25.ptr != (Answer *)0x0) {
              if (((MVar25.ptr)->redirectedResults).ptr.isSet == true) {
                pRVar27 = (RpcConnectionState *)
                          ((MVar25.ptr)->redirectedResults).ptr.field_1.value.super_PromiseBase.node
                          .disposer;
                pPVar47 = ((MVar25.ptr)->redirectedResults).ptr.field_1.value.super_PromiseBase.node
                          .ptr;
                ((MVar25.ptr)->redirectedResults).ptr.field_1.value.super_PromiseBase.node.ptr =
                     (PromiseNode *)0x0;
                bVar4 = 0;
                local_348.value.super_PromiseBase.node.disposer = (Disposer *)pRVar27;
              }
              else {
                pPVar47 = (PromiseNode *)0x0;
              }
            }
          }
LAB_003b1dfc:
          uVar38 = *(uint *)&(local_498->super_ErrorHandler)._vptr_ErrorHandler;
        }
        ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Question>::
        erase((Question *)local_308,&this->questions,uVar38,(Question *)pRVar27);
        uVar17 = stack0xfffffffffffffd00;
        uVar44 = local_308._0_8_;
        if ((RpcConnectionState *)local_308._0_8_ != (RpcConnectionState *)0x0) {
          local_308._0_8_ = (RpcConnectionState *)0x0;
          stack0xfffffffffffffd00 = (RpcConnectionState *)0x0;
          (*(code *)**(undefined8 **)local_2f8)(local_2f8,uVar44,4,uVar17,uVar17,0);
        }
        if ((!(bool)(bVar4 | pPVar47 == (PromiseNode *)0x0)) &&
           ((*(code *)**(undefined8 **)local_348._0_8_)
                      (local_348._0_8_,
                       (_func_int *)
                       ((long)&pPVar47->_vptr_PromiseNode + (long)pPVar47->_vptr_PromiseNode[-2])),
           this = (RpcConnectionState *)local_368.ptr, plVar26 = (long *)local_368.size_,
           (local_368.disposer._0_1_ & 1) != 0)) goto LAB_003b071a;
      }
      else if ((uint)local_488 < 0x40) {
switchD_003b1abe_caseD_0:
        if ((((Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
               *)(pEVar3 + 4))->ptr).field_0x1 == '\x01') {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[67]>
                    ((Fault *)local_308,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x9c2,FAILED,"!question->isTailCall",
                     "\"Tail call `Return` must set `resultsSentElsewhere`, not `results`.\"",
                     (char (*) [67])
                     "Tail call `Return` must set `resultsSentElsewhere`, not `results`.");
          kj::_::Debug::Fault::~Fault((Fault *)local_308);
        }
        else {
          bVar49 = local_488._4_2_ == 0;
          local_198._16_8_ = local_490;
          if (bVar49) {
            local_198._16_8_ = (RpcConnectionState *)0x0;
          }
          uVar50 = 0x7fffffff;
          if (!bVar49) {
            uVar50 = local_480._0_4_;
          }
          local_198._0_4_ = 0;
          local_198._4_4_ = 0;
          local_198._8_4_ = 0;
          local_198._12_4_ = 0;
          if (!bVar49) {
            local_198._0_4_ = local_4a8._0_4_;
            local_198._4_4_ = local_4a8._4_4_;
            local_198._8_4_ = local_4a8._8_4_;
            local_198._12_4_ = uStack_49c;
          }
          iStack_180 = uVar50;
          PointerReader::getStruct((StructReader *)local_308,(PointerReader *)local_198,(word *)0x0)
          ;
          local_438._16_8_ = (Refcounted *)(_iStack_2f0 + 8);
          if ((ushort)local_2e8[0]._4_2_ < DISCONNECTED) {
            local_438._16_8_ = (Refcounted *)0x0;
          }
          if ((ushort)local_2e8[0]._4_2_ < DISCONNECTED) {
            local_438._0_4_ = 0;
            local_438._4_4_ = 0;
            local_438._8_4_ = 0;
            local_438._12_4_ = 0;
            uVar50 = 0x7fffffff;
          }
          else {
            local_438._0_4_ = local_308._0_4_;
            local_438._4_4_ = local_308._4_4_;
            local_438._8_4_ = local_308._8_4_;
            local_438._12_4_ = uStack_2fc;
            uVar50 = local_2e8[0]._8_4_;
          }
          local_438._24_4_ = uVar50;
          PointerReader::getList
                    ((ListReader *)local_198,(PointerReader *)local_438,INLINE_COMPOSITE,(word *)0x0
                    );
          capTable_00.reader.capTable = (CapTableReader *)local_198._8_8_;
          capTable_00.reader.segment = (SegmentReader *)local_198._0_8_;
          capTable_00.reader.ptr = (byte *)local_198._16_8_;
          capTable_00.reader._24_8_ = _iStack_180;
          capTable_00.reader.structDataSize = local_178._0_4_;
          capTable_00.reader.structPointerCount = local_178._4_2_;
          capTable_00.reader.elementSize = local_178[6];
          capTable_00.reader._39_1_ = local_178[7];
          capTable_00.reader._40_8_ = local_178._8_8_;
          receiveCaps((Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)(local_438 + 0x30),this,
                      capTable_00);
          pWVar46[1].offsetAndKind.value = pWVar46[1].offsetAndKind.value + 1;
          bVar49 = local_2e8[0]._4_2_ != FAILED;
          local_330[1].ptr = (PromiseNode *)(RpcConnectionState *)0x0;
          if (bVar49) {
            local_330[1].ptr = (PromiseNode *)_iStack_2f0;
          }
          uVar50 = 0x7fffffff;
          if (bVar49) {
            uVar50 = local_2e8[0]._8_4_;
          }
          local_348._0_8_ = (RpcConnectionState *)0x0;
          local_348._8_8_ = (RpcConnectionState *)0x0;
          if (bVar49) {
            local_348._0_8_ = local_308._0_8_;
            local_348._8_8_ = stack0xfffffffffffffd00;
          }
          pAVar35 = (AttachmentPromiseNodeBase *)operator_new(0x88);
          unique0x10006065 = local_408.size_;
          local_3c8._0_8_ = local_408.ptr;
          local_4b8 = (RpcConnectionState *)local_408.disposer;
          local_408.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
          local_408.size_ = 0;
          *(undefined4 *)&(pAVar35->dependency).ptr = 0;
          (pAVar35->super_PromiseNode)._vptr_PromiseNode =
               (_func_int **)&PTR__RpcResponseImpl_00621ae8;
          (pAVar35->dependency).disposer = (Disposer *)&PTR_disposeImpl_00621b18;
          puVar1 = &(this->super_Refcounted).refcount;
          *puVar1 = *puVar1 + 1;
          local_458._24_8_ = &pAVar35->dependency;
          pAVar35[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&this->super_Refcounted;
          pAVar35[1].dependency.disposer = (Disposer *)this;
          pIVar6 = message->ptr;
          pAVar35[1].dependency.ptr = (PromiseNode *)message->disposer;
          pAVar35[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)pIVar6;
          message->ptr = (IncomingRpcMessage *)0x0;
          local_3b8 = local_408.disposer;
          local_4c8._0_8_ = (RpcConnectionState *)0x0;
          local_4c8._8_8_ = (TransformPromiseNodeBase *)0x0;
          ReaderCapabilityTable::ReaderCapabilityTable
                    ((ReaderCapabilityTable *)&pAVar35[2].dependency,
                     (Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)local_3c8);
          uVar17 = stack0xfffffffffffffc40;
          uVar44 = local_3c8._0_8_;
          if ((RpcConnectionState *)local_3c8._0_8_ != (RpcConnectionState *)0x0) {
            local_3c8._0_8_ = (RpcConnectionState *)0x0;
            stack0xfffffffffffffc40 = (TransformPromiseNodeBase *)0x0;
            (*(code *)**(undefined8 **)local_3b8)
                      (local_3b8,uVar44,0x10,uVar17,uVar17,
                       kj::ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>::
                       destruct);
          }
          local_438._0_8_ = local_348._0_8_;
          local_438._8_8_ = local_348._8_8_;
          local_438._16_8_ = local_330[1].ptr;
          local_438._24_4_ = uVar50;
          PointerReader::imbue
                    ((PointerReader *)&pAVar35[3].dependency.ptr,(PointerReader *)local_438,
                     (CapTableReader *)&pAVar35[2].dependency);
          pAVar35[5].super_PromiseNode._vptr_PromiseNode = (_func_int **)pWVar46;
          pAVar35[5].dependency.disposer = (Disposer *)pWVar46;
          ppPVar2 = &(pAVar35->dependency).ptr;
          *(int *)ppPVar2 = *(int *)ppPVar2 + 1;
          local_468.disposer = (Disposer *)local_458._24_8_;
          local_468.ptr = (PromiseNode *)pAVar35;
          QuestionRef::fulfill
                    ((QuestionRef *)pWVar46[6],
                     (Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse> *)
                     &local_468);
          pPVar47 = local_468.ptr;
          if ((AttachmentPromiseNodeBase *)local_468.ptr != (AttachmentPromiseNodeBase *)0x0) {
            local_468.ptr = (PromiseNode *)0x0;
            (**((Disposer *)&(local_468.disposer)->_vptr_Disposer)->_vptr_Disposer)
                      (local_468.disposer,
                       (_func_int *)
                       ((long)&((PromiseNode *)&pPVar47->_vptr_PromiseNode)->_vptr_PromiseNode +
                       (long)((PromiseNode *)&pPVar47->_vptr_PromiseNode)->_vptr_PromiseNode[-2]));
          }
        }
      }
      else {
        switch(*(undefined2 *)((long)&(local_498->super_ErrorHandler)._vptr_ErrorHandler + 6)) {
        case 0:
          goto switchD_003b1abe_caseD_0;
        case 1:
          if ((((Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
                 *)(pEVar3 + 4))->ptr).field_0x1 == '\x01') {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[69]>
                      ((Fault *)local_308,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x9d0,FAILED,"!question->isTailCall",
                       "\"Tail call `Return` must set `resultsSentElsewhere`, not `exception`.\"",
                       (char (*) [69])
                       "Tail call `Return` must set `resultsSentElsewhere`, not `exception`.");
            kj::_::Debug::Fault::~Fault((Fault *)local_308);
          }
          else {
            bVar49 = local_488._4_2_ == 0;
            local_438._16_8_ = local_490;
            if (bVar49) {
              local_438._16_8_ = (RpcConnectionState *)0x0;
            }
            uVar50 = 0x7fffffff;
            if (!bVar49) {
              uVar50 = local_480._0_4_;
            }
            local_438._0_4_ = 0;
            local_438._4_4_ = 0;
            local_438._8_4_ = 0;
            local_438._12_4_ = 0;
            if (!bVar49) {
              local_438._0_4_ = local_4a8._0_4_;
              local_438._4_4_ = local_4a8._4_4_;
              local_438._8_4_ = local_4a8._8_4_;
              local_438._12_4_ = uStack_49c;
            }
            local_438._24_4_ = uVar50;
            PointerReader::getStruct
                      ((StructReader *)local_198,(PointerReader *)local_438,(word *)0x0);
            toException((Exception *)local_308,(Reader *)local_198);
            (**(code **)(*(long *)pWVar46[6] + 8))(pWVar46[6],local_308);
            kj::Exception::~Exception((Exception *)local_308);
          }
          break;
        case 2:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                    ((Fault *)local_308,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x9d8,FAILED,(char *)0x0,
                     "\"Return message falsely claims call was canceled.\"",
                     (char (*) [49])"Return message falsely claims call was canceled.");
          kj::_::Debug::Fault::~Fault((Fault *)local_308);
          break;
        case 3:
          if ((((Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
                 *)(pEVar3 + 4))->ptr).field_0x1 == '\0') {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[66]>
                      ((Fault *)local_308,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x9dd,FAILED,"question->isTailCall",
                       "\"`Return` had `resultsSentElsewhere` but this was not a tail call.\"",
                       (char (*) [66])
                       "`Return` had `resultsSentElsewhere` but this was not a tail call.");
            kj::_::Debug::Fault::~Fault((Fault *)local_308);
          }
          else {
            local_308._0_8_ = (RpcConnectionState *)0x0;
            stack0xfffffffffffffd00 = (RpcConnectionState *)0x0;
            QuestionRef::fulfill
                      ((QuestionRef *)pWVar46[6],
                       (Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse> *)
                       local_308);
            uVar44 = stack0xfffffffffffffd00;
            if ((RpcConnectionState *)stack0xfffffffffffffd00 != (RpcConnectionState *)0x0) {
              stack0xfffffffffffffd00 = (RpcConnectionState *)0x0;
              (*(code *)**(undefined8 **)local_308._0_8_)
                        (local_308._0_8_,uVar44 + *(long *)(*(long *)uVar44 + -0x10));
            }
          }
          break;
        case 4:
          uVar38 = 0;
          if (0x5f < (uint)local_488) {
            uVar38 = *(uint *)&(local_498->super_Refcounted).super_Disposer._vptr_Disposer;
          }
          MVar25 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>
                   ::find(&this->answers,uVar38);
          if (MVar25.ptr == (Answer *)0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
                      ((Fault *)local_308,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x9ee,FAILED,(char *)0x0,
                       "\"`Return.takeFromOtherQuestion` had invalid answer ID.\"",
                       (char (*) [54])"`Return.takeFromOtherQuestion` had invalid answer ID.");
            kj::_::Debug::Fault::~Fault((Fault *)local_308);
          }
          else if (((MVar25.ptr)->redirectedResults).ptr.isSet == true) {
            (*(code *)**(undefined8 **)pWVar46[6])
                      (pWVar46[6],&((MVar25.ptr)->redirectedResults).ptr.field_1);
          }
          else {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[92]>
                      ((Fault *)local_308,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x9eb,FAILED,(char *)0x0,
                       "\"`Return.takeFromOtherQuestion` referenced a call that did not \" \"use `sendResultsTo.yourself`.\""
                       ,(char (*) [92])
                        "`Return.takeFromOtherQuestion` referenced a call that did not use `sendResultsTo.yourself`."
                      );
            kj::_::Debug::Fault::~Fault((Fault *)local_308);
          }
          break;
        default:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                    ((Fault *)local_308,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x9f4,FAILED,(char *)0x0,"\"Unknown \'Return\' type.\"",
                     (char (*) [23])"Unknown \'Return\' type.");
          kj::_::Debug::Fault::~Fault((Fault *)local_308);
        }
      }
    }
LAB_003b06ec:
    lVar40 = plVar26[1];
    if (lVar40 != 0) {
      lVar48 = *plVar26;
      lVar43 = 0;
      do {
        releaseExport(this,*(ExportId *)(lVar48 + lVar43),1);
        lVar43 = lVar43 + 4;
      } while (lVar40 << 2 != lVar43);
    }
LAB_003b071a:
    uVar17 = local_458._8_8_;
    uVar44 = local_458._0_8_;
    if ((SegmentReader *)local_458._0_8_ == (SegmentReader *)0x0) {
      return;
    }
    local_458._0_8_ = (ArrayDisposer *)0x0;
    local_458._8_8_ = (SegmentReader *)0x0;
    (***(_func_int ***)local_458._16_8_)(local_458._16_8_,uVar44,4,uVar17,uVar17,0);
    return;
  case 4:
    uVar38 = 0;
    if (local_398._36_2_ == 0) {
      local_398._24_8_ = (RpcConnectionState *)0x0;
      local_398._40_4_ = 0x7fffffff;
    }
    local_308._0_4_ = 0;
    local_308._4_4_ = 0;
    local_308._8_4_ = 0;
    uStack_2fc = 0;
    if (local_398._36_2_ != 0) {
      local_308._0_4_ = local_398._0_4_;
      local_308._4_4_ = local_398._4_4_;
      local_308._8_4_ = local_398._8_4_;
      uStack_2fc = local_398._12_4_;
    }
    iStack_2f0 = local_398._40_4_;
    local_2f8 = local_398._24_8_;
    PointerReader::getStruct((StructReader *)local_4a8,(PointerReader *)local_308,(word *)0x0);
    unique0x00005300 = local_438;
    local_438._0_8_ = (SegmentReader *)0x0;
    local_438._8_8_ = (CapTableReader *)0x0;
    local_438._16_8_ = (ArrayDisposer *)0x0;
    local_3b8 = local_3b8 & 0xffffffffffffff00;
    local_308._0_8_ = local_308._0_8_ & 0xffffffffffffff00;
    stack0xfffffffffffffd00 = (CapTableReader *)0x0;
    local_2f8 = (WirePointer *)0x0;
    _iStack_2f0 = _iStack_2f0 & 0xffffffffffffff00;
    local_2e8[1]._0_8_ = 0;
    local_2e8[1]._8_8_ = (ArrayDisposer *)0x0;
    local_2e8[2]._0_8_ = (Disposer *)0x0;
    local_2e8[2]._8_8_ = (Context *)0x0;
    this_00 = &this->answers;
    uVar19 = (uint)local_488;
    if (0x1f < (uint)local_488) {
      uVar38 = *(uint *)&(local_498->super_ErrorHandler)._vptr_ErrorHandler;
    }
    this_01 = this_00;
    local_3c8._0_8_ = this;
    MVar25 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>
             ::find(this_00,uVar38);
    if (MVar25.ptr == (Answer *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                ((Fault *)this_01,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xa24,FAILED,"answer->active","\"\'Finish\' for invalid question ID.\"",
                 (char (*) [34])"\'Finish\' for invalid question ID.");
      kj::_::Debug::Fault::~Fault((Fault *)this_01);
    }
    else if ((MVar25.ptr)->active == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                ((Fault *)local_198,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xa12,FAILED,"answer->active","\"\'Finish\' for invalid question ID.\"",
                 (char (*) [34])"\'Finish\' for invalid question ID.");
      kj::_::Debug::Fault::~Fault((Fault *)local_198);
    }
    else {
      if ((uVar19 < 0x21) ||
         (((ulong)(local_498->super_ErrorHandler)._vptr_ErrorHandler & 0x100000000) == 0)) {
        local_438._16_8_ = ((MVar25.ptr)->resultExports).disposer;
        local_438._0_8_ = ((MVar25.ptr)->resultExports).ptr;
        local_438._8_8_ = ((MVar25.ptr)->resultExports).size_;
        ((MVar25.ptr)->resultExports).ptr = (uint *)0x0;
        ((MVar25.ptr)->resultExports).size_ = 0;
      }
      else {
        puVar8 = ((MVar25.ptr)->resultExports).ptr;
        if (puVar8 != (uint *)0x0) {
          sVar9 = ((MVar25.ptr)->resultExports).size_;
          ((MVar25.ptr)->resultExports).ptr = (uint *)0x0;
          ((MVar25.ptr)->resultExports).size_ = 0;
          pAVar10 = ((MVar25.ptr)->resultExports).disposer;
          (**pAVar10->_vptr_ArrayDisposer)(pAVar10,puVar8,4,sVar9,sVar9,0);
        }
      }
      pDVar11 = ((MVar25.ptr)->pipeline).ptr.disposer;
      pPVar12 = ((MVar25.ptr)->pipeline).ptr.ptr;
      ((MVar25.ptr)->pipeline).ptr.ptr = (PipelineHook *)0x0;
      pRVar32 = ((MVar25.ptr)->callContext).ptr;
      if (pRVar32 == (RpcCallContext *)0x0) {
        uVar38 = 0;
        if (0x1f < (uint)local_488) {
          uVar38 = *(uint *)&(local_498->super_ErrorHandler)._vptr_ErrorHandler;
        }
        ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>::
        erase((Answer *)local_198,this_00,uVar38);
        Answer::operator=((Answer *)local_308,(Answer *)local_198);
        uVar17 = aStack_160.value.super_PromiseBase.node.ptr;
        uVar44 = aStack_160.value.super_PromiseBase.node.disposer;
        if ((RpcConnectionState *)aStack_160.value.super_PromiseBase.node.disposer !=
            (RpcConnectionState *)0x0) {
          aStack_160.value.super_PromiseBase.node.disposer = (Disposer *)0x0;
          aStack_160.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
          (*(code *)((SegmentReader *)
                    ((ErrorHandler *)&((Disposer *)uStack_150)->_vptr_Disposer)->_vptr_ErrorHandler)
                    ->arena)(uStack_150,uVar44,4,uVar17,uVar17,0);
        }
        uVar44 = local_178._8_8_;
        if (((undefined1)iStack_180 == '\x01') &&
           ((RpcConnectionState *)local_178._8_8_ != (RpcConnectionState *)0x0)) {
          local_178._8_8_ = (RpcConnectionState *)0x0;
          (*(code *)((SegmentReader *)((ErrorHandler *)local_178._0_8_)->_vptr_ErrorHandler)->arena)
                    (local_178._0_8_,uVar44 + *(long *)(*(_func_int **)uVar44 + -0x10));
        }
        uVar44 = local_198._16_8_;
        if ((RpcConnectionState *)local_198._16_8_ != (RpcConnectionState *)0x0) {
          local_198._16_8_ = (RpcConnectionState *)0x0;
          (***(_func_int ***)local_198._8_8_)(local_198._8_8_,(*(_func_int ***)uVar44)[-2] + uVar44)
          ;
        }
      }
      else {
        bVar4 = pRVar32->cancellationFlags;
        pRVar32->cancellationFlags = bVar4 | 1;
        if (bVar4 == 2) {
          pPVar15 = (pRVar32->cancelFulfiller).ptr;
          (**pPVar15->_vptr_PromiseFulfiller)(pPVar15,local_198);
        }
      }
      if (pPVar12 != (PipelineHook *)0x0) {
        (**pDVar11->_vptr_Disposer)
                  (pDVar11,(_func_int *)
                           ((long)&pPVar12->_vptr_PipelineHook +
                           (long)pPVar12->_vptr_PipelineHook[-2]));
      }
    }
    uVar17 = local_2e8[2]._0_8_;
    uVar44 = local_2e8[1]._8_8_;
    if ((ArrayDisposer *)local_2e8[1]._8_8_ != (ArrayDisposer *)0x0) {
      local_2e8[1]._8_8_ = (ArrayDisposer *)0x0;
      local_2e8[2]._0_8_ = (Disposer *)0x0;
      (*(code *)**(undefined8 **)local_2e8[2]._8_8_)(local_2e8[2]._8_8_,uVar44,4,uVar17,uVar17,0);
    }
    uVar44 = local_2e8[0].value.super_PromiseBase.node.ptr;
    if (((undefined1)iStack_2f0 == '\x01') &&
       ((RpcConnectionState *)local_2e8[0]._8_8_ != (RpcConnectionState *)0x0)) {
      local_2e8[0].value.super_PromiseBase.node.ptr = (RpcConnectionState *)0x0;
      (*(code *)((SegmentReader *)
                ((ErrorHandler *)&((Disposer *)local_2e8[0]._0_8_)->_vptr_Disposer)->
                _vptr_ErrorHandler)->arena)
                (local_2e8[0].value.super_PromiseBase.node.disposer,
                 (long)&((ErrorHandler *)&((PromiseNode *)uVar44)->_vptr_PromiseNode)->
                        _vptr_ErrorHandler +
                 ((SegmentReader *)
                 ((ErrorHandler *)&((PromiseNode *)uVar44)->_vptr_PromiseNode)->_vptr_ErrorHandler)
                 [-1].ptr.size_);
    }
    uVar44 = local_2f8;
    if ((WirePointer *)local_2f8 != (WirePointer *)0x0) {
      local_2f8 = (WirePointer *)0x0;
      (***(_func_int ***)stack0xfffffffffffffd00)
                (stack0xfffffffffffffd00,uVar44 + *(long *)((long)*(WirePointer *)uVar44 + -0x10));
    }
    uVar44 = local_438._0_8_;
    pSVar34 = (SegmentReader *)local_438._0_8_;
    if ((CapTableReader *)local_438._8_8_ != (CapTableReader *)0x0) {
      lVar48 = local_438._8_8_ << 2;
      lVar40 = 0;
      do {
        releaseExport(this,*(ExportId *)(uVar44 + lVar40),1);
        lVar40 = lVar40 + 4;
        pSVar34 = (SegmentReader *)local_438._0_8_;
      } while (lVar48 != lVar40);
    }
    uVar44 = local_438._8_8_;
    if (pSVar34 == (SegmentReader *)0x0) {
      return;
    }
    local_438._0_8_ = (SegmentReader *)0x0;
    local_438._8_8_ = (CapTableReader *)0x0;
    (***(_func_int ***)local_438._16_8_)(local_438._16_8_,pSVar34,4,uVar44,uVar44,0);
    return;
  case 5:
    if (local_398._36_2_ == 0) {
      local_398._24_8_ = (RpcConnectionState *)0x0;
      local_398._40_4_ = 0x7fffffff;
    }
    local_308._0_4_ = 0;
    local_308._4_4_ = 0;
    local_308._8_4_ = 0;
    uStack_2fc = 0;
    if (local_398._36_2_ != 0) {
      local_308._0_4_ = local_398._0_4_;
      local_308._4_4_ = local_398._4_4_;
      local_308._8_4_ = local_398._8_4_;
      uStack_2fc = local_398._12_4_;
    }
    iStack_2f0 = local_398._40_4_;
    local_2f8 = local_398._24_8_;
    PointerReader::getStruct((StructReader *)local_438,(PointerReader *)local_308,(word *)0x0);
    local_4c8._0_8_ = (RpcConnectionState *)0x0;
    local_4c8._8_8_ = (TransformPromiseNodeBase *)0x0;
    local_308._0_8_ = local_308._0_8_ & 0xffffffffffffff00;
    if ((uint)local_438._32_4_ < 0x30) {
LAB_003afc15:
      local_498 = (RpcConnectionState *)local_438._24_8_;
      if (local_438._36_2_ == 0) {
        local_498 = (RpcConnectionState *)0x0;
      }
      local_4a8._0_4_ = 0;
      local_4a8._4_4_ = 0;
      local_4a8._8_4_ = 0;
      uStack_49c = 0;
      iVar36 = 0x7fffffff;
      if (local_438._36_2_ != 0) {
        local_4a8._0_4_ = local_438._0_4_;
        local_4a8._4_4_ = local_438._4_4_;
        local_4a8._8_4_ = local_438._8_4_;
        uStack_49c = local_438._12_4_;
        iVar36 = local_438._40_4_;
      }
      local_490 = (RpcConnectionState *)CONCAT44(local_490._4_4_,iVar36);
      PointerReader::getStruct((StructReader *)local_198,(PointerReader *)local_4a8,(word *)0x0);
      descriptor._reader.capTable = (CapTableReader *)local_198._8_8_;
      descriptor._reader.segment = (SegmentReader *)local_198._0_8_;
      descriptor._reader.data = (void *)local_198._16_8_;
      descriptor._reader.pointers = (WirePointer *)_iStack_180;
      descriptor._reader.dataSize = local_178._0_4_;
      descriptor._reader.pointerCount = local_178._4_2_;
      descriptor._reader._38_2_ = local_178._6_2_;
      descriptor._reader._40_8_ = local_178._8_8_;
      receiveCap((RpcConnectionState *)local_3c8,descriptor);
      if ((TransformPromiseNodeBase *)stack0xfffffffffffffc40 == (TransformPromiseNodeBase *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
                  ((Fault *)local_4a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0xa35,FAILED,(char *)0x0,"\"\'Resolve\' contained \'CapDescriptor.none\'.\"",
                   (char (*) [42])"\'Resolve\' contained \'CapDescriptor.none\'.");
        kj::_::Debug::Fault::~Fault((Fault *)local_4a8);
      }
      else {
        local_4c8._0_8_ = local_3c8._0_8_;
        local_4c8._8_8_ = stack0xfffffffffffffc40;
LAB_003b0f08:
        uVar38 = 0;
        if (0x1f < (uint)local_438._32_4_) {
          uVar38 = *(uint *)local_438._16_8_;
        }
        MVar31 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Import>
                 ::find(&this->imports,uVar38);
        if (MVar31.ptr != (Import *)0x0) {
          pPVar13 = ((MVar31.ptr)->promiseFulfiller).ptr.ptr;
          if (pPVar13 == (PromiseFulfiller<kj::Own<capnp::ClientHook>_> *)0x0) {
            if (((MVar31.ptr)->importClient).ptr != (ImportClient *)0x0) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
                        ((Fault *)local_4a8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                         ,0xa50,FAILED,(char *)0x0,"\"Got \'Resolve\' for a non-promise import.\"",
                         (char (*) [40])"Got \'Resolve\' for a non-promise import.");
              kj::_::Debug::Fault::~Fault((Fault *)local_4a8);
            }
          }
          else if (local_308[0] == '\x01') {
            (*pPVar13->_vptr_PromiseFulfiller[1])(pPVar13,local_308 + 8);
          }
          else {
            (**pPVar13->_vptr_PromiseFulfiller)(pPVar13,local_4c8);
          }
        }
      }
    }
    else {
      if (*(short *)(local_438._16_8_ + 4) == 1) {
        local_3b8 = local_438._24_8_;
        if (local_438._36_2_ == 0) {
          local_3b8 = (RpcConnectionState *)0x0;
        }
        local_3c8._0_4_ = 0;
        local_3c8._4_4_ = 0;
        local_3c8._8_4_ = 0;
        uStack_3bc = 0;
        iVar36 = 0x7fffffff;
        if (local_438._36_2_ != 0) {
          local_3c8._0_4_ = local_438._0_4_;
          local_3c8._4_4_ = local_438._4_4_;
          local_3c8._8_4_ = local_438._8_4_;
          uStack_3bc = local_438._12_4_;
          iVar36 = local_438._40_4_;
        }
        iStack_3b0 = iVar36;
        PointerReader::getStruct((StructReader *)local_4a8,(PointerReader *)local_3c8,(word *)0x0);
        toException((Exception *)local_198,(Reader *)local_4a8);
        if (local_308[0] == '\x01') {
          local_308._0_8_ = local_308._0_8_ & 0xffffffffffffff00;
          kj::Exception::~Exception((Exception *)(local_308 + 8));
        }
        stack0xfffffffffffffd00 = local_198._0_8_;
        local_2f8 = local_198._8_8_;
        _iStack_2f0 = local_198._16_8_;
        local_198._0_8_ = (RpcConnectionState *)0x0;
        local_198._8_8_ = (RpcConnectionState *)0x0;
        local_2e8[0].value.super_PromiseBase.node.disposer = _iStack_180;
        local_2e8[0].value.super_PromiseBase.node.ptr = local_178._0_8_;
        local_2e8[1]._0_8_ = local_178._8_8_;
        local_2e8[1]._8_8_ = local_178._16_8_;
        local_178._8_8_ = (RpcConnectionState *)0x0;
        local_178._16_8_ = (RpcConnectionState *)0x0;
        local_2e8[2]._0_8_ = aStack_160.value.super_PromiseBase.node.disposer;
        local_2e8[2]._8_8_ = aStack_160.value.super_PromiseBase.node.ptr;
        local_2b8 = uStack_150;
        uStack_150 = (RpcConnectionState *)0x0;
        memcpy(local_2b0,&stack0xfffffffffffffeb8,0x104);
        local_308[0] = 1;
        kj::Exception::~Exception((Exception *)local_198);
        goto LAB_003b0f08;
      }
      if (*(short *)(local_438._16_8_ + 4) == 0) goto LAB_003afc15;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                ((Fault *)local_198,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xa41,FAILED,(char *)0x0,"\"Unknown \'Resolve\' type.\"",
                 (char (*) [24])"Unknown \'Resolve\' type.");
      kj::_::Debug::Fault::~Fault((Fault *)local_198);
    }
    if (local_308[0] == '\x01') {
      kj::Exception::~Exception((Exception *)(local_308 + 8));
    }
    goto LAB_003b19e9;
  case 6:
    refcount = 0;
    bVar49 = local_398._36_2_ == 0;
    local_198._16_8_ = local_398._24_8_;
    if (bVar49) {
      local_198._16_8_ = (RpcConnectionState *)0x0;
    }
    iVar36 = 0x7fffffff;
    if (!bVar49) {
      iVar36 = local_398._40_4_;
    }
    local_198[8] = false;
    local_198._9_3_ = 0;
    local_198._0_4_ = 0;
    local_198._4_4_ = 0;
    local_198._12_4_ = 0;
    if (!bVar49) {
      local_198._0_4_ = local_398._0_4_;
      local_198._4_4_ = local_398._4_4_;
      local_198._8_4_ = local_398._8_4_;
      local_198._12_4_ = local_398._12_4_;
    }
    iStack_180 = iVar36;
    PointerReader::getStruct((StructReader *)local_308,(PointerReader *)local_198,(word *)0x0);
    if ((uint)local_2e8[0]._0_4_ < 0x20) {
      id = 0;
    }
    else {
      id = *(ExportId *)local_2f8;
      if (0x3f < (uint)local_2e8[0]._0_4_) {
        refcount = *(uint *)(local_2f8 + 4);
      }
    }
    goto LAB_003b0774;
  default:
    if ((this->connection).tag != 1) {
      return;
    }
    puVar7 = *(undefined8 **)((long)&(this->connection).field_1 + 8);
    MVar53 = StructReader::totalSize((StructReader *)local_398);
    uVar37 = (ulong)(MVar53.capCount << 2) + MVar53.wordCount;
    if (0xfffff < uVar37) {
      uVar37 = 0x100000;
    }
    (**(code **)*puVar7)(local_4c8,puVar7,(int)uVar37 + 3);
    (**(code **)*(_func_int **)local_4c8._8_8_)(local_3c8);
    local_2f8 = local_3b8;
    local_308._0_8_ = local_3c8._0_8_;
    stack0xfffffffffffffd00 = stack0xfffffffffffffc40;
    PointerBuilder::initStruct
              ((StructBuilder *)local_4a8,(PointerBuilder *)local_308,(StructSize)0x10001);
    local_308._0_8_ = CONCAT44(local_398._4_4_,local_398._0_4_);
    unique0x10003786 = CONCAT44(local_398._12_4_,local_398._8_4_);
    local_2e8[0]._0_8_ = CONCAT26(local_398._38_2_,CONCAT24(local_398._36_2_,local_398._32_4_));
    local_2e8[0]._8_8_ = CONCAT44(local_398._44_4_,local_398._40_4_);
    local_198._16_8_ = local_398._16_8_;
    _iStack_180 = local_398._24_8_;
    *(undefined2 *)&(local_498->super_ErrorHandler)._vptr_ErrorHandler = 0;
    local_2f8 = local_398._16_8_;
    _iStack_2f0 = local_398._24_8_;
    local_438._0_8_ = local_4a8._0_8_;
    local_438._8_8_ = stack0xfffffffffffffb60;
    local_438._16_8_ = local_490;
    local_198._0_8_ = local_308._0_8_;
    local_198._8_8_ = unique0x10003786;
    local_178._8_8_ = local_2e8[0]._8_8_;
    PointerBuilder::setStruct((PointerBuilder *)local_438,(StructReader *)local_308,false);
    (**(code **)(*(_func_int **)local_4c8._8_8_ + 8))();
LAB_003b19e9:
    pTVar28 = (TransformPromiseNodeBase *)local_4c8._8_8_;
    if ((TransformPromiseNodeBase *)local_4c8._8_8_ == (TransformPromiseNodeBase *)0x0) {
      return;
    }
    local_4c8._8_8_ = (TransformPromiseNodeBase *)0x0;
    pRVar39 = (RpcConnectionState *)local_4c8._0_8_;
LAB_003b1a01:
    p_Var42 = (_func_int *)
              ((long)&(pTVar28->super_PromiseNode)._vptr_PromiseNode +
              (long)(pTVar28->super_PromiseNode)._vptr_PromiseNode[-2]);
    pSVar34 = (SegmentReader *)(pRVar39->super_ErrorHandler)._vptr_ErrorHandler;
    goto LAB_003b1a66;
  case 8:
    pRVar39 = (RpcConnectionState *)0x0;
    bVar49 = local_398._36_2_ == 0;
    local_2f8 = local_398._24_8_;
    if (bVar49) {
      local_2f8 = pRVar39;
    }
    iStack_2f0 = 0x7fffffff;
    if (!bVar49) {
      iStack_2f0 = local_398._40_4_;
    }
    local_308._0_4_ = 0;
    local_308._4_4_ = 0;
    local_308._8_4_ = 0;
    uStack_2fc = 0;
    if (!bVar49) {
      local_308._0_4_ = local_398._0_4_;
      local_308._4_4_ = local_398._4_4_;
      local_308._8_4_ = local_398._8_4_;
      uStack_2fc = local_398._12_4_;
    }
    PointerReader::getStruct((StructReader *)local_438,(PointerReader *)local_308,(word *)0x0);
    if (0x1f < (uint)local_438._32_4_) {
      pRVar39 = (RpcConnectionState *)(ulong)*(uint *)local_438._16_8_;
    }
    uVar38 = (uint)pRVar39;
    local_468.disposer = (Disposer *)CONCAT44(local_468.disposer._4_4_,uVar38);
    if ((this->connection).tag != 1) {
      return;
    }
    pRVar27 = *(RpcConnectionState **)((long)&(this->connection).field_1 + 8);
    (*(code *)((SegmentReader *)(pRVar27->super_ErrorHandler)._vptr_ErrorHandler)->arena)
              (&local_368,pRVar27,0x28);
    (*(code *)**(undefined8 **)local_368.size_)(local_4a8);
    local_198._16_8_ = local_498;
    local_198._0_8_ = local_4a8._0_8_;
    local_198._8_8_ = stack0xfffffffffffffb60;
    PointerBuilder::getStruct
              ((StructBuilder *)local_308,(PointerBuilder *)local_198,(StructSize)0x10001,
               (word *)0x0);
    *(undefined2 *)local_2f8 = 3;
    local_198._0_8_ = local_308._0_8_;
    local_198._8_8_ = stack0xfffffffffffffd00;
    local_198._16_8_ = _iStack_2f0;
    PointerBuilder::initStruct
              ((StructBuilder *)local_3c8,(PointerBuilder *)local_198,(StructSize)0x10002);
    *(uint *)local_3b8 = uVar38;
    local_480._8_8_ = local_438 + 0x30;
    local_408.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    local_408.size_ = 0;
    local_480.value._vptr_Client = (_func_int **)local_4c8;
    local_4c8._0_8_ = (RpcConnectionState *)0x0;
    local_4c8._8_8_ = (TransformPromiseNodeBase *)0x0;
    local_4b8 = (RpcConnectionState *)0x0;
    local_458._16_8_ = local_458._16_8_ & 0xffffffffffffff00;
    local_4a8._0_8_ = &PTR_run_00620280;
    unique0x10006731 = (_func_int **)local_438;
    local_498 = this;
    local_490 = pRVar27;
    local_488 = (StructBuilder *)local_3c8;
    local_458._0_8_ = this;
    local_458._8_8_ = local_480.value._vptr_Client;
    kj::_::runCatchingExceptions((Maybe<kj::Exception> *)local_198,(Runnable *)local_4a8);
    local_308[0] = local_198[0];
    uVar24 = local_198[0];
    if (local_198[0] == true) {
      stack0xfffffffffffffd00 = local_198._8_8_;
      local_2f8 = local_198._16_8_;
      _iStack_2f0 = _iStack_180;
      local_198._8_8_ = (RpcConnectionState *)0x0;
      local_198._16_8_ = (RpcConnectionState *)0x0;
      local_2e8[0].value.super_PromiseBase.node.disposer = local_178._0_8_;
      local_2e8[0].value.super_PromiseBase.node.ptr = local_178._8_8_;
      local_2e8[1]._0_8_ = local_178._16_8_;
      local_2e8[1]._8_8_ = aStack_160.value.super_PromiseBase.node.disposer;
      local_178._16_8_ = (RpcConnectionState *)0x0;
      aStack_160.value.super_PromiseBase.node.disposer = (Disposer *)0x0;
      local_2e8[2]._0_8_ = aStack_160.value.super_PromiseBase.node.ptr;
      local_2e8[2]._8_8_ = uStack_150;
      local_2b8 = local_148;
      local_148 = (RpcConnectionState *)0x0;
      memcpy(local_2b0,&stack0xfffffffffffffec0,0x104);
      kj::Exception::~Exception((Exception *)(local_198 + 8));
      uVar24 = local_308[0];
    }
    exception = (Exception *)(local_308 + 8);
    if ((uVar24 & 1) != 0) {
      *(undefined2 *)(local_3b8 + 6) = 1;
      local_4a8._0_8_ = local_3c8._0_8_;
      stack0xfffffffffffffb60 = (_func_int **)stack0xfffffffffffffc40;
      local_498 = (RpcConnectionState *)_iStack_3b0;
      PointerBuilder::initStruct
                ((StructBuilder *)local_198,(PointerBuilder *)local_4a8,(StructSize)0x10001);
      builder._builder.capTable = (CapTableBuilder *)local_198._8_8_;
      builder._builder.segment = (SegmentBuilder *)local_198._0_8_;
      builder._builder.data = (void *)local_198._16_8_;
      builder._builder.pointers = (WirePointer *)_iStack_180;
      builder._builder.dataSize = local_178._0_4_;
      builder._builder.pointerCount = local_178._4_2_;
      builder._builder._38_2_ = local_178._6_2_;
      fromException(exception,builder);
      OVar52 = newBrokenCap((capnp *)local_4a8,exception);
      pMVar22 = local_408.ptr;
      pTVar28 = (TransformPromiseNodeBase *)stack0xfffffffffffffb60;
      stack0xfffffffffffffb60 = (_func_int **)0x0;
      pRVar27 = (RpcConnectionState *)local_4a8._0_8_;
      if (((TransformPromiseNodeBase *)local_408.size_ != (TransformPromiseNodeBase *)0x0) &&
         (lVar40 = local_408.size_ + *(long *)(*(long *)local_408.size_ + -0x10),
         puVar7 = *(undefined8 **)local_408.ptr,
         local_408.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)(RpcConnectionState *)local_4a8._0_8_
         , local_408.size_ = (size_t)pTVar28, (*(code *)*puVar7)(pMVar22,lVar40,OVar52.ptr),
         DVar18._vptr_Disposer = stack0xfffffffffffffb60,
         pRVar27 = (RpcConnectionState *)local_408.ptr,
         pTVar28 = (TransformPromiseNodeBase *)local_408.size_,
         (RpcConnectionState *)stack0xfffffffffffffb60 != (RpcConnectionState *)0x0)) {
        stack0xfffffffffffffb60 = (_func_int **)0x0;
        (**(code **)*(_func_int **)local_4a8._0_8_)
                  (local_4a8._0_8_,
                   (long)DVar18._vptr_Disposer + *(long *)(*DVar18._vptr_Disposer + -0x10));
        pRVar27 = (RpcConnectionState *)local_408.ptr;
        pTVar28 = (TransformPromiseNodeBase *)local_408.size_;
      }
      local_408.size_ = (size_t)pTVar28;
      local_408.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)pRVar27;
      uVar24 = local_308[0];
    }
    if ((uVar24 & 1) != 0) {
      kj::Exception::~Exception(exception);
    }
    pIVar6 = message->ptr;
    if (pIVar6 != (IncomingRpcMessage *)0x0) {
      message->ptr = (IncomingRpcMessage *)0x0;
      (**message->disposer->_vptr_Disposer)
                (message->disposer,
                 (_func_int *)
                 ((long)&pIVar6->_vptr_IncomingRpcMessage +
                 (long)pIVar6->_vptr_IncomingRpcMessage[-2]));
    }
    local_308._0_4_ = uVar38;
    if (uVar38 < 0x10) {
      pmVar29 = (mapped_type *)&(this->answers).low[(long)pRVar39].active;
    }
    else {
      pmVar29 = std::
                unordered_map<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>_>_>
                ::operator[](&(this->answers).high,(key_type *)local_308);
    }
    if (pmVar29->active == false) {
      puVar8 = (pmVar29->resultExports).ptr;
      if (puVar8 != (uint *)0x0) {
        sVar9 = (pmVar29->resultExports).size_;
        (pmVar29->resultExports).ptr = (uint *)0x0;
        (pmVar29->resultExports).size_ = 0;
        pAVar10 = (pmVar29->resultExports).disposer;
        (**pAVar10->_vptr_ArrayDisposer)(pAVar10,puVar8,4,sVar9,sVar9,0);
      }
      (pmVar29->resultExports).ptr = (uint *)local_4c8._0_8_;
      (pmVar29->resultExports).size_ = local_4c8._8_8_;
      (pmVar29->resultExports).disposer = (ArrayDisposer *)local_4b8;
      local_4c8._0_8_ = (RpcConnectionState *)0x0;
      local_4c8._8_8_ = (TransformPromiseNodeBase *)0x0;
      pmVar29->active = true;
      pPVar30 = (PipelineHook *)operator_new(0x28);
      pPVar30->_vptr_PipelineHook = (_func_int **)&PTR_addRef_006203c0;
      pPVar30[1]._vptr_PipelineHook = (_func_int **)&DAT_006203f8;
      *(undefined4 *)&pPVar30[3]._vptr_PipelineHook = local_408.ptr._0_4_;
      *(undefined4 *)((long)&pPVar30[3]._vptr_PipelineHook + 4) = local_408.ptr._4_4_;
      *(undefined4 *)&pPVar30[4]._vptr_PipelineHook = (undefined4)local_408.size_;
      *(undefined4 *)((long)&pPVar30[4]._vptr_PipelineHook + 4) = local_408.size_._4_4_;
      local_408.size_ = 0;
      *(undefined4 *)&pPVar30[2]._vptr_PipelineHook = 1;
      pDVar11 = (pmVar29->pipeline).ptr.disposer;
      pPVar12 = (pmVar29->pipeline).ptr.ptr;
      (pmVar29->pipeline).ptr.disposer = (Disposer *)(pPVar30 + 1);
      (pmVar29->pipeline).ptr.ptr = pPVar30;
      if (pPVar12 != (PipelineHook *)0x0) {
        (**pDVar11->_vptr_Disposer)
                  (pDVar11,(_func_int *)
                           ((long)&pPVar12->_vptr_PipelineHook +
                           (long)pPVar12->_vptr_PipelineHook[-2]));
      }
      (**(code **)(*(long *)local_368.size_ + 8))();
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29],unsigned_int&>
                ((Fault *)local_308,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x8e4,FAILED,"!answer.active","\"questionId is already in use\", answerId",
                 (char (*) [29])"questionId is already in use",(uint *)&local_468);
      kj::_::Debug::Fault::~Fault((Fault *)local_308);
    }
    uVar44 = local_4c8._0_8_;
    if ((TransformPromiseNodeBase *)local_4c8._8_8_ != (TransformPromiseNodeBase *)0x0) {
      lVar48 = local_4c8._8_8_ << 2;
      lVar40 = 0;
      do {
        releaseExport(this,*(ExportId *)(uVar44 + lVar40),1);
        lVar40 = lVar40 + 4;
      } while (lVar48 != lVar40);
    }
    uVar17 = local_4c8._8_8_;
    uVar44 = local_4c8._0_8_;
    if ((RpcConnectionState *)local_4c8._0_8_ != (RpcConnectionState *)0x0) {
      local_4c8._0_8_ = (RpcConnectionState *)0x0;
      local_4c8._8_8_ = (TransformPromiseNodeBase *)0x0;
      (*(code *)((SegmentReader *)(local_4b8->super_ErrorHandler)._vptr_ErrorHandler)->arena)
                (local_4b8,uVar44,4,uVar17,uVar17,0);
    }
    sVar9 = local_408.size_;
    if ((TransformPromiseNodeBase *)local_408.size_ != (TransformPromiseNodeBase *)0x0) {
      local_408.size_ = 0;
      (*(code *)**(undefined8 **)local_408.ptr)
                (local_408.ptr,sVar9 + *(long *)(*(long *)sVar9 + -0x10));
    }
    pTVar28 = (TransformPromiseNodeBase *)local_368.size_;
    if ((TransformPromiseNodeBase *)local_368.size_ == (TransformPromiseNodeBase *)0x0) {
      return;
    }
    local_368.size_ = 0;
    pRVar39 = (RpcConnectionState *)local_368.ptr;
    goto LAB_003b1a01;
  case 0xd:
    bVar49 = local_398._36_2_ == 0;
    local_2f8 = local_398._24_8_;
    if (bVar49) {
      local_2f8 = (RpcConnectionState *)0x0;
    }
    iStack_2f0 = 0x7fffffff;
    if (!bVar49) {
      iStack_2f0 = local_398._40_4_;
    }
    local_308._0_4_ = 0;
    local_308._4_4_ = 0;
    local_308._8_4_ = 0;
    uStack_2fc = 0;
    if (!bVar49) {
      local_308._0_4_ = local_398._0_4_;
      local_308._4_4_ = local_398._4_4_;
      local_308._8_4_ = local_398._8_4_;
      uStack_2fc = local_398._12_4_;
    }
    PointerReader::getStruct((StructReader *)local_198,(PointerReader *)local_308,(word *)0x0);
    uVar44 = local_198._16_8_;
    if ((uint)local_178._0_4_ < 0x30) {
LAB_003b0410:
      bVar49 = local_178._4_2_ == 0;
      local_498 = (RpcConnectionState *)_iStack_180;
      if (bVar49) {
        local_498 = (RpcConnectionState *)0x0;
      }
      iVar36 = 0x7fffffff;
      if (!bVar49) {
        iVar36 = local_178._8_4_;
      }
      uVar50._0_1_ = false;
      uVar50._1_3_ = 0;
      local_4a8._0_4_ = 0;
      local_4a8._4_4_ = 0;
      uStack_49c = 0;
      if (!bVar49) {
        local_4a8._0_4_ = local_198._0_4_;
        local_4a8._4_4_ = local_198._4_4_;
        uVar50 = local_198._8_4_;
        uStack_49c = local_198._12_4_;
      }
      local_4a8[8] = SUB41(uVar50,0);
      local_4a8._9_3_ = SUB43(uVar50,1);
      local_490 = (RpcConnectionState *)CONCAT44(local_490._4_4_,iVar36);
      PointerReader::getStruct((StructReader *)local_308,(PointerReader *)local_4a8,(word *)0x0);
      getMessageTarget((RpcConnectionState *)local_4a8,(Reader *)this);
      if ((RpcConnectionState *)stack0xfffffffffffffb60 == (RpcConnectionState *)0x0) {
        return;
      }
      local_348._0_4_ = local_178._0_4_;
      local_330[1].ptr = (PromiseNode *)uVar44;
      pRVar39 = (RpcConnectionState *)local_4a8._0_8_;
      uVar44 = stack0xfffffffffffffb60;
      while (plVar26 = (long *)(*(code *)(((SegmentReader *)
                                          (((RpcConnectionState *)uVar44)->super_ErrorHandler).
                                          _vptr_ErrorHandler)->ptr).ptr)(uVar44),
            plVar26 != (long *)0x0) {
        (**(code **)(*plVar26 + 0x20))(local_308,plVar26);
        uVar20 = stack0xfffffffffffffd00;
        uVar17 = local_308._0_8_;
        stack0xfffffffffffffd00 = (RpcConnectionState *)0x0;
        (*(code *)((SegmentReader *)(pRVar39->super_ErrorHandler)._vptr_ErrorHandler)->arena)
                  (pRVar39,(long)&(((RpcConnectionState *)uVar44)->super_ErrorHandler).
                                  _vptr_ErrorHandler +
                           ((SegmentReader *)
                           (((RpcConnectionState *)uVar44)->super_ErrorHandler)._vptr_ErrorHandler)
                           [-1].ptr.size_);
        uVar23 = stack0xfffffffffffffd00;
        pRVar39 = (RpcConnectionState *)uVar17;
        uVar44 = uVar20;
        if ((RpcConnectionState *)stack0xfffffffffffffd00 != (RpcConnectionState *)0x0) {
          stack0xfffffffffffffd00 = (RpcConnectionState *)0x0;
          (*(code *)**(undefined8 **)local_308._0_8_)
                    (local_308._0_8_,uVar23 + *(long *)(*(long *)uVar23 + -0x10));
        }
      }
      pRVar27 = (RpcConnectionState *)
                (*(code *)((SegmentReader *)
                          (((RpcConnectionState *)uVar44)->super_ErrorHandler)._vptr_ErrorHandler)
                          [1].arena)(uVar44);
      if (pRVar27 == this) {
        uVar50 = 0;
        if (0x1f < (uint)local_348._0_4_) {
          uVar50 = *(undefined4 *)local_330[1].ptr;
        }
        kj::_::yield();
        pTVar28 = (TransformPromiseNodeBase *)operator_new(0x48);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar28,(Own<kj::_::PromiseNode> *)local_308,
                   kj::
                   CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2705:21),_kj::Own<capnp::ClientHook>_>
                   ::operator()<>);
        uVar17 = stack0xfffffffffffffd00;
        (pTVar28->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00621b78;
        pTVar28[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
        *(undefined4 *)&pTVar28[1].dependency.disposer = uVar50;
        pTVar28[1].dependency.ptr = (PromiseNode *)pRVar39;
        pTVar28[1].continuationTracePtr = (void *)uVar44;
        local_4a8._0_8_ =
             &kj::_::
              HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::{lambda(kj::Own<capnp::ClientHook>&&)#1},kj::Own<capnp::ClientHook>>,kj::_::PropagateException>>
              ::instance;
        unique0x10006739 = (_func_int **)pTVar28;
        if ((RpcConnectionState *)stack0xfffffffffffffd00 != (RpcConnectionState *)0x0) {
          stack0xfffffffffffffd00 = (RpcConnectionState *)0x0;
          (*(code *)**(undefined8 **)local_308._0_8_)
                    (local_308._0_8_,uVar17 + *(long *)(*(long *)uVar17 + -0x10));
        }
        kj::TaskSet::add(&this->tasks,(Promise<void> *)local_4a8);
        DVar18._vptr_Disposer = stack0xfffffffffffffb60;
        if ((TransformPromiseNodeBase *)stack0xfffffffffffffb60 == (TransformPromiseNodeBase *)0x0)
        {
          return;
        }
        stack0xfffffffffffffb60 = (_func_int **)0x0;
        (**(code **)*(_func_int **)local_4a8._0_8_)
                  (local_4a8._0_8_,
                   (long)DVar18._vptr_Disposer + *(long *)(*DVar18._vptr_Disposer + -0x10));
        return;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[96]>
                ((Fault *)local_308,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xa88,FAILED,"target->getBrand() == this",
                 "\"\'Disembargo\' of type \'senderLoopback\' sent to an object that does not point \" \"back to the sender.\""
                 ,(char (*) [96])
                  "\'Disembargo\' of type \'senderLoopback\' sent to an object that does not point back to the sender."
                );
      kj::_::Debug::Fault::~Fault((Fault *)local_308);
      p_Var42 = (_func_int *)
                ((long)&(((RpcConnectionState *)uVar44)->super_ErrorHandler)._vptr_ErrorHandler +
                ((SegmentReader *)
                (((RpcConnectionState *)uVar44)->super_ErrorHandler)._vptr_ErrorHandler)[-1].ptr.
                size_);
      pSVar34 = (SegmentReader *)(pRVar39->super_ErrorHandler)._vptr_ErrorHandler;
      goto LAB_003b1a66;
    }
    if (*(short *)(local_198._16_8_ + 4) != 1) {
      if (*(short *)(local_198._16_8_ + 4) != 0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,char_const(&)[31],capnp::rpc::Disembargo::Reader_const&>
                  ((Fault *)local_308,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0xac0,FAILED,(char *)0x0,"\"Unimplemented Disembargo type.\", disembargo",
                   (char (*) [31])"Unimplemented Disembargo type.",(Reader *)local_198);
LAB_003b19bb:
        kj::_::Debug::Fault::~Fault((Fault *)local_308);
        return;
      }
      goto LAB_003b0410;
    }
    pEVar14 = (this->embargoes).slots.builder.ptr;
    if (((ulong)((long)(this->embargoes).slots.builder.pos - (long)pEVar14 >> 4) <=
         (ulong)*(uint *)local_198._16_8_) ||
       (pPVar15 = pEVar14[*(uint *)local_198._16_8_].fulfiller.ptr.ptr,
       pPVar15 == (PromiseFulfiller<void> *)0x0)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
                ((Fault *)local_308,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xab8,FAILED,(char *)0x0,
                 "\"Invalid embargo ID in \'Disembargo.context.receiverLoopback\'.\"",
                 (char (*) [61])"Invalid embargo ID in \'Disembargo.context.receiverLoopback\'.");
      goto LAB_003b19bb;
    }
    (**pPVar15->_vptr_PromiseFulfiller)(pPVar15,local_308);
    uVar38 = *(uint *)uVar44;
    local_308._0_4_ = uVar38;
    pEVar14 = (this->embargoes).slots.builder.ptr;
    pRVar39 = (RpcConnectionState *)pEVar14[uVar38].fulfiller.ptr.disposer;
    pRVar27 = (RpcConnectionState *)pEVar14[uVar38].fulfiller.ptr.ptr;
    pEVar14[uVar38].fulfiller.ptr.disposer = (Disposer *)0x0;
    pEVar14[uVar38].fulfiller.ptr.ptr = (PromiseFulfiller<void> *)0x0;
    std::
    priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
    ::push(&(this->embargoes).freeIds,(value_type *)local_308);
    if (pRVar27 == (RpcConnectionState *)0x0) {
      return;
    }
  }
  p_Var42 = (_func_int *)
            ((long)&(pRVar27->super_ErrorHandler)._vptr_ErrorHandler +
            ((SegmentReader *)(pRVar27->super_ErrorHandler)._vptr_ErrorHandler)[-1].ptr.size_);
  pSVar34 = (SegmentReader *)(pRVar39->super_ErrorHandler)._vptr_ErrorHandler;
LAB_003b1a66:
  (*(code *)pSVar34->arena)(pRVar39,p_Var42);
  return;
}

Assistant:

void handleMessage(kj::Own<IncomingRpcMessage> message) {
    auto reader = message->getBody().getAs<rpc::Message>();

    switch (reader.which()) {
      case rpc::Message::UNIMPLEMENTED:
        handleUnimplemented(reader.getUnimplemented());
        break;

      case rpc::Message::ABORT:
        handleAbort(reader.getAbort());
        break;

      case rpc::Message::BOOTSTRAP:
        handleBootstrap(kj::mv(message), reader.getBootstrap());
        break;

      case rpc::Message::CALL:
        handleCall(kj::mv(message), reader.getCall());
        break;

      case rpc::Message::RETURN:
        handleReturn(kj::mv(message), reader.getReturn());
        break;

      case rpc::Message::FINISH:
        handleFinish(reader.getFinish());
        break;

      case rpc::Message::RESOLVE:
        handleResolve(reader.getResolve());
        break;

      case rpc::Message::RELEASE:
        handleRelease(reader.getRelease());
        break;

      case rpc::Message::DISEMBARGO:
        handleDisembargo(reader.getDisembargo());
        break;

      default: {
        if (connection.is<Connected>()) {
          auto message = connection.get<Connected>()->newOutgoingMessage(
              firstSegmentSize(reader.totalSize(), messageSizeHint<void>()));
          message->getBody().initAs<rpc::Message>().setUnimplemented(reader);
          message->send();
        }
        break;
      }
    }
  }